

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx2::CurveNiMBIntersector1<8>::
     intersect_t<embree::avx2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Primitive PVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  int iVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  bool bVar61;
  undefined1 auVar62 [12];
  bool bVar63;
  bool bVar64;
  bool bVar65;
  bool bVar66;
  bool bVar67;
  bool bVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  uint uVar83;
  ulong uVar84;
  ulong uVar85;
  long lVar86;
  undefined4 uVar87;
  ulong uVar88;
  long lVar89;
  bool bVar90;
  float fVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 extraout_var [60];
  undefined1 auVar115 [64];
  undefined1 extraout_var_00 [60];
  float fVar116;
  float fVar147;
  float fVar148;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar146 [32];
  undefined8 uVar153;
  undefined1 auVar154 [16];
  undefined1 auVar160 [16];
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar155 [16];
  float fVar169;
  float fVar173;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar174 [16];
  undefined1 auVar191 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [64];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar195;
  float fVar211;
  float fVar212;
  undefined1 auVar196 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar213;
  float fVar216;
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar201 [16];
  undefined1 auVar209 [32];
  undefined1 auVar202 [28];
  float fVar214;
  float fVar215;
  undefined1 auVar210 [64];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar223 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [64];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [16];
  float fVar241;
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [64];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [28];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [32];
  undefined4 uVar278;
  undefined1 auVar272 [16];
  undefined1 auVar257 [32];
  float fVar260;
  float fVar261;
  float fVar262;
  undefined1 in_ZMM10 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 in_ZMM11 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined4 uVar277;
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  undefined1 auVar279 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_aec;
  ulong local_ae8;
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  ulong local_a78;
  RTCFilterFunctionNArguments local_a70;
  undefined1 local_a40 [32];
  undefined1 local_a10 [8];
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [16];
  undefined8 local_9d0;
  float local_9c8;
  float local_9c4;
  undefined4 local_9c0;
  uint local_9bc;
  uint local_9b8;
  uint local_9b4;
  uint local_9b0;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  undefined1 auStack_910 [16];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  undefined1 auStack_7f0 [16];
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined1 local_7c0 [16];
  Primitive *local_7b0;
  ulong local_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined4 uStack_764;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined4 local_300;
  undefined4 uStack_2fc;
  undefined4 uStack_2f8;
  undefined4 uStack_2f4;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  undefined1 local_2e0 [32];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  
  PVar6 = prim[1];
  uVar88 = (ulong)(byte)PVar6;
  lVar89 = uVar88 * 0x25;
  fVar116 = *(float *)(prim + lVar89 + 0x12);
  auVar99 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + lVar89 + 6));
  auVar154._0_4_ = fVar116 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar154._4_4_ = fVar116 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar154._8_4_ = fVar116 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar154._12_4_ = fVar116 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar92._0_4_ = fVar116 * auVar99._0_4_;
  auVar92._4_4_ = fVar116 * auVar99._4_4_;
  auVar92._8_4_ = fVar116 * auVar99._8_4_;
  auVar92._12_4_ = fVar116 * auVar99._12_4_;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + uVar88 * 4 + 6);
  auVar109 = vpmovsxbd_avx2(auVar99);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar198._8_8_ = 0;
  auVar198._0_8_ = *(ulong *)(prim + uVar88 * 5 + 6);
  auVar102 = vpmovsxbd_avx2(auVar198);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar222._8_8_ = 0;
  auVar222._0_8_ = *(ulong *)(prim + uVar88 * 6 + 6);
  auVar145 = vpmovsxbd_avx2(auVar222);
  auVar145 = vcvtdq2ps_avx(auVar145);
  auVar124._8_8_ = 0;
  auVar124._0_8_ = *(ulong *)(prim + uVar88 * 0xf + 6);
  auVar16 = vpmovsxbd_avx2(auVar124);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  auVar164 = vpmovsxbd_avx2(auVar4);
  auVar164 = vcvtdq2ps_avx(auVar164);
  auVar272._8_8_ = 0;
  auVar272._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar88 + 6);
  auVar232 = vpmovsxbd_avx2(auVar272);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar88 * 0x1a + 6);
  auVar17 = vpmovsxbd_avx2(auVar5);
  auVar232 = vcvtdq2ps_avx(auVar232);
  auVar133._8_8_ = 0;
  auVar133._0_8_ = *(ulong *)(prim + uVar88 * 0x1b + 6);
  auVar256 = vpmovsxbd_avx2(auVar133);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar159._8_8_ = 0;
  auVar159._0_8_ = *(ulong *)(prim + uVar88 * 0x1c + 6);
  auVar275 = vpmovsxbd_avx2(auVar159);
  auVar256 = vcvtdq2ps_avx(auVar256);
  auVar275 = vcvtdq2ps_avx(auVar275);
  auVar244._4_4_ = auVar154._0_4_;
  auVar244._0_4_ = auVar154._0_4_;
  auVar244._8_4_ = auVar154._0_4_;
  auVar244._12_4_ = auVar154._0_4_;
  auVar244._16_4_ = auVar154._0_4_;
  auVar244._20_4_ = auVar154._0_4_;
  auVar244._24_4_ = auVar154._0_4_;
  auVar244._28_4_ = auVar154._0_4_;
  auVar99 = vmovshdup_avx(auVar154);
  uVar153 = auVar99._0_8_;
  auVar288._8_8_ = uVar153;
  auVar288._0_8_ = uVar153;
  auVar288._16_8_ = uVar153;
  auVar288._24_8_ = uVar153;
  auVar99 = vshufps_avx(auVar154,auVar154,0xaa);
  fVar116 = auVar99._0_4_;
  auVar266._0_4_ = fVar116 * auVar145._0_4_;
  fVar91 = auVar99._4_4_;
  auVar266._4_4_ = fVar91 * auVar145._4_4_;
  auVar266._8_4_ = fVar116 * auVar145._8_4_;
  auVar266._12_4_ = fVar91 * auVar145._12_4_;
  auVar266._16_4_ = fVar116 * auVar145._16_4_;
  auVar266._20_4_ = fVar91 * auVar145._20_4_;
  auVar266._28_36_ = in_ZMM11._28_36_;
  auVar266._24_4_ = fVar116 * auVar145._24_4_;
  auVar258._0_4_ = auVar232._0_4_ * fVar116;
  auVar258._4_4_ = auVar232._4_4_ * fVar91;
  auVar258._8_4_ = auVar232._8_4_ * fVar116;
  auVar258._12_4_ = auVar232._12_4_ * fVar91;
  auVar258._16_4_ = auVar232._16_4_ * fVar116;
  auVar258._20_4_ = auVar232._20_4_ * fVar91;
  auVar258._28_36_ = in_ZMM10._28_36_;
  auVar258._24_4_ = auVar232._24_4_ * fVar116;
  auVar252._0_4_ = auVar275._0_4_ * fVar116;
  auVar252._4_4_ = auVar275._4_4_ * fVar91;
  auVar252._8_4_ = auVar275._8_4_ * fVar116;
  auVar252._12_4_ = auVar275._12_4_ * fVar91;
  auVar252._16_4_ = auVar275._16_4_ * fVar116;
  auVar252._20_4_ = auVar275._20_4_ * fVar91;
  auVar252._24_4_ = auVar275._24_4_ * fVar116;
  auVar252._28_4_ = 0;
  auVar99 = vfmadd231ps_fma(auVar266._0_32_,auVar288,auVar102);
  auVar198 = vfmadd231ps_fma(auVar258._0_32_,auVar288,auVar164);
  auVar222 = vfmadd231ps_fma(auVar252,auVar256,auVar288);
  auVar124 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar244,auVar109);
  auVar198 = vfmadd231ps_fma(ZEXT1632(auVar198),auVar244,auVar16);
  auVar222 = vfmadd231ps_fma(ZEXT1632(auVar222),auVar17,auVar244);
  auVar245._4_4_ = auVar92._0_4_;
  auVar245._0_4_ = auVar92._0_4_;
  auVar245._8_4_ = auVar92._0_4_;
  auVar245._12_4_ = auVar92._0_4_;
  auVar245._16_4_ = auVar92._0_4_;
  auVar245._20_4_ = auVar92._0_4_;
  auVar245._24_4_ = auVar92._0_4_;
  auVar245._28_4_ = auVar92._0_4_;
  auVar99 = vmovshdup_avx(auVar92);
  uVar153 = auVar99._0_8_;
  auVar289._8_8_ = uVar153;
  auVar289._0_8_ = uVar153;
  auVar289._16_8_ = uVar153;
  auVar289._24_8_ = uVar153;
  auVar99 = vshufps_avx(auVar92,auVar92,0xaa);
  fVar116 = auVar99._0_4_;
  auVar161._0_4_ = fVar116 * auVar145._0_4_;
  fVar91 = auVar99._4_4_;
  auVar161._4_4_ = fVar91 * auVar145._4_4_;
  auVar161._8_4_ = fVar116 * auVar145._8_4_;
  auVar161._12_4_ = fVar91 * auVar145._12_4_;
  auVar161._16_4_ = fVar116 * auVar145._16_4_;
  auVar161._20_4_ = fVar91 * auVar145._20_4_;
  auVar161._24_4_ = fVar116 * auVar145._24_4_;
  auVar161._28_4_ = 0;
  auVar190._4_4_ = auVar232._4_4_ * fVar91;
  auVar190._0_4_ = auVar232._0_4_ * fVar116;
  auVar190._8_4_ = auVar232._8_4_ * fVar116;
  auVar190._12_4_ = auVar232._12_4_ * fVar91;
  auVar190._16_4_ = auVar232._16_4_ * fVar116;
  auVar190._20_4_ = auVar232._20_4_ * fVar91;
  auVar190._24_4_ = auVar232._24_4_ * fVar116;
  auVar190._28_4_ = auVar145._28_4_;
  auVar145._4_4_ = auVar275._4_4_ * fVar91;
  auVar145._0_4_ = auVar275._0_4_ * fVar116;
  auVar145._8_4_ = auVar275._8_4_ * fVar116;
  auVar145._12_4_ = auVar275._12_4_ * fVar91;
  auVar145._16_4_ = auVar275._16_4_ * fVar116;
  auVar145._20_4_ = auVar275._20_4_ * fVar91;
  auVar145._24_4_ = auVar275._24_4_ * fVar116;
  auVar145._28_4_ = fVar91;
  auVar99 = vfmadd231ps_fma(auVar161,auVar289,auVar102);
  auVar4 = vfmadd231ps_fma(auVar190,auVar289,auVar164);
  auVar272 = vfmadd231ps_fma(auVar145,auVar289,auVar256);
  auVar92 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar245,auVar109);
  local_7a0._8_4_ = 0x7fffffff;
  local_7a0._0_8_ = 0x7fffffff7fffffff;
  local_7a0._12_4_ = 0x7fffffff;
  local_7a0._16_4_ = 0x7fffffff;
  local_7a0._20_4_ = 0x7fffffff;
  local_7a0._24_4_ = 0x7fffffff;
  local_7a0._28_4_ = 0x7fffffff;
  auVar273._8_4_ = 0x219392ef;
  auVar273._0_8_ = 0x219392ef219392ef;
  auVar273._12_4_ = 0x219392ef;
  auVar273._16_4_ = 0x219392ef;
  auVar273._20_4_ = 0x219392ef;
  auVar273._24_4_ = 0x219392ef;
  auVar273._28_4_ = 0x219392ef;
  auVar109 = vandps_avx(ZEXT1632(auVar124),local_7a0);
  auVar109 = vcmpps_avx(auVar109,auVar273,1);
  auVar102 = vblendvps_avx(ZEXT1632(auVar124),auVar273,auVar109);
  auVar109 = vandps_avx(ZEXT1632(auVar198),local_7a0);
  auVar109 = vcmpps_avx(auVar109,auVar273,1);
  auVar145 = vblendvps_avx(ZEXT1632(auVar198),auVar273,auVar109);
  auVar109 = vandps_avx(ZEXT1632(auVar222),local_7a0);
  auVar109 = vcmpps_avx(auVar109,auVar273,1);
  auVar109 = vblendvps_avx(ZEXT1632(auVar222),auVar273,auVar109);
  auVar154 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar245,auVar16);
  auVar93 = vfmadd231ps_fma(ZEXT1632(auVar272),auVar245,auVar17);
  fVar116 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar89 + 0x16)) *
            *(float *)(prim + lVar89 + 0x1a);
  auVar236._4_4_ = fVar116;
  auVar236._0_4_ = fVar116;
  auVar236._8_4_ = fVar116;
  auVar236._12_4_ = fVar116;
  auVar236._16_4_ = fVar116;
  auVar236._20_4_ = fVar116;
  auVar236._24_4_ = fVar116;
  auVar236._28_4_ = fVar116;
  auVar16 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar88 * 7 + 6));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar164 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar88 * 0xb + 6));
  auVar164 = vcvtdq2ps_avx(auVar164);
  auVar164 = vsubps_avx(auVar164,auVar16);
  auVar232 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar88 * 9 + 6));
  auVar124 = vfmadd213ps_fma(auVar164,auVar236,auVar16);
  auVar164 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar88 * 0xd + 6));
  auVar16 = vcvtdq2ps_avx(auVar232);
  auVar164 = vcvtdq2ps_avx(auVar164);
  auVar164 = vsubps_avx(auVar164,auVar16);
  auVar4 = vfmadd213ps_fma(auVar164,auVar236,auVar16);
  auVar16 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar88 * 0x12 + 6));
  auVar16 = vcvtdq2ps_avx(auVar16);
  uVar84 = (ulong)(uint)((int)(uVar88 * 5) << 2);
  auVar164 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar88 * 2 + uVar84 + 6));
  auVar164 = vcvtdq2ps_avx(auVar164);
  auVar164 = vsubps_avx(auVar164,auVar16);
  auVar232 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar84 + 6));
  auVar272 = vfmadd213ps_fma(auVar164,auVar236,auVar16);
  auVar16 = vcvtdq2ps_avx(auVar232);
  auVar164 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar88 * 0x18 + 6));
  auVar164 = vcvtdq2ps_avx(auVar164);
  auVar164 = vsubps_avx(auVar164,auVar16);
  auVar5 = vfmadd213ps_fma(auVar164,auVar236,auVar16);
  auVar258 = ZEXT1664(auVar5);
  auVar16 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar88 * 0x1d + 6));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar164 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar88 + (ulong)(byte)PVar6 * 0x20 + 6));
  auVar164 = vcvtdq2ps_avx(auVar164);
  auVar164 = vsubps_avx(auVar164,auVar16);
  auVar133 = vfmadd213ps_fma(auVar164,auVar236,auVar16);
  auVar266 = ZEXT1664(auVar133);
  auVar16 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar6 * 0x20 - uVar88) + 6));
  auVar16 = vcvtdq2ps_avx(auVar16);
  local_7b0 = prim;
  auVar164 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar88 * 0x23 + 6));
  auVar164 = vcvtdq2ps_avx(auVar164);
  auVar164 = vsubps_avx(auVar164,auVar16);
  auVar159 = vfmadd213ps_fma(auVar164,auVar236,auVar16);
  auVar16 = vrcpps_avx(auVar102);
  auVar268._8_4_ = 0x3f800000;
  auVar268._0_8_ = &DAT_3f8000003f800000;
  auVar268._12_4_ = 0x3f800000;
  auVar268._16_4_ = 0x3f800000;
  auVar268._20_4_ = 0x3f800000;
  auVar268._24_4_ = 0x3f800000;
  auVar268._28_4_ = 0x3f800000;
  auVar99 = vfnmadd213ps_fma(auVar102,auVar16,auVar268);
  auVar99 = vfmadd132ps_fma(ZEXT1632(auVar99),auVar16,auVar16);
  auVar102 = vrcpps_avx(auVar145);
  auVar198 = vfnmadd213ps_fma(auVar145,auVar102,auVar268);
  auVar198 = vfmadd132ps_fma(ZEXT1632(auVar198),auVar102,auVar102);
  auVar102 = vrcpps_avx(auVar109);
  auVar222 = vfnmadd213ps_fma(auVar109,auVar102,auVar268);
  auVar222 = vfmadd132ps_fma(ZEXT1632(auVar222),auVar102,auVar102);
  auVar109 = vsubps_avx(ZEXT1632(auVar124),ZEXT1632(auVar92));
  auVar102 = vsubps_avx(ZEXT1632(auVar4),ZEXT1632(auVar92));
  auVar16._4_4_ = auVar99._4_4_ * auVar109._4_4_;
  auVar16._0_4_ = auVar99._0_4_ * auVar109._0_4_;
  auVar16._8_4_ = auVar99._8_4_ * auVar109._8_4_;
  auVar16._12_4_ = auVar99._12_4_ * auVar109._12_4_;
  auVar16._16_4_ = auVar109._16_4_ * 0.0;
  auVar16._20_4_ = auVar109._20_4_ * 0.0;
  auVar16._24_4_ = auVar109._24_4_ * 0.0;
  auVar16._28_4_ = auVar109._28_4_;
  auVar164._4_4_ = auVar99._4_4_ * auVar102._4_4_;
  auVar164._0_4_ = auVar99._0_4_ * auVar102._0_4_;
  auVar164._8_4_ = auVar99._8_4_ * auVar102._8_4_;
  auVar164._12_4_ = auVar99._12_4_ * auVar102._12_4_;
  auVar164._16_4_ = auVar102._16_4_ * 0.0;
  auVar164._20_4_ = auVar102._20_4_ * 0.0;
  auVar164._24_4_ = auVar102._24_4_ * 0.0;
  auVar164._28_4_ = auVar102._28_4_;
  auVar109 = vsubps_avx(ZEXT1632(auVar272),ZEXT1632(auVar154));
  auVar102 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar154));
  auVar232._4_4_ = auVar198._4_4_ * auVar109._4_4_;
  auVar232._0_4_ = auVar198._0_4_ * auVar109._0_4_;
  auVar232._8_4_ = auVar198._8_4_ * auVar109._8_4_;
  auVar232._12_4_ = auVar198._12_4_ * auVar109._12_4_;
  auVar232._16_4_ = auVar109._16_4_ * 0.0;
  auVar232._20_4_ = auVar109._20_4_ * 0.0;
  auVar232._24_4_ = auVar109._24_4_ * 0.0;
  auVar232._28_4_ = auVar109._28_4_;
  auVar17._4_4_ = auVar198._4_4_ * auVar102._4_4_;
  auVar17._0_4_ = auVar198._0_4_ * auVar102._0_4_;
  auVar17._8_4_ = auVar198._8_4_ * auVar102._8_4_;
  auVar17._12_4_ = auVar198._12_4_ * auVar102._12_4_;
  auVar17._16_4_ = auVar102._16_4_ * 0.0;
  auVar17._20_4_ = auVar102._20_4_ * 0.0;
  auVar17._24_4_ = auVar102._24_4_ * 0.0;
  auVar17._28_4_ = auVar102._28_4_;
  auVar109 = vsubps_avx(ZEXT1632(auVar133),ZEXT1632(auVar93));
  auVar256._4_4_ = auVar222._4_4_ * auVar109._4_4_;
  auVar256._0_4_ = auVar222._0_4_ * auVar109._0_4_;
  auVar256._8_4_ = auVar222._8_4_ * auVar109._8_4_;
  auVar256._12_4_ = auVar222._12_4_ * auVar109._12_4_;
  auVar256._16_4_ = auVar109._16_4_ * 0.0;
  auVar256._20_4_ = auVar109._20_4_ * 0.0;
  auVar256._24_4_ = auVar109._24_4_ * 0.0;
  auVar256._28_4_ = auVar109._28_4_;
  auVar109 = vsubps_avx(ZEXT1632(auVar159),ZEXT1632(auVar93));
  auVar275._4_4_ = auVar222._4_4_ * auVar109._4_4_;
  auVar275._0_4_ = auVar222._0_4_ * auVar109._0_4_;
  auVar275._8_4_ = auVar222._8_4_ * auVar109._8_4_;
  auVar275._12_4_ = auVar222._12_4_ * auVar109._12_4_;
  auVar275._16_4_ = auVar109._16_4_ * 0.0;
  auVar275._20_4_ = auVar109._20_4_ * 0.0;
  auVar275._24_4_ = auVar109._24_4_ * 0.0;
  auVar275._28_4_ = auVar109._28_4_;
  auVar109 = vpminsd_avx2(auVar16,auVar164);
  auVar102 = vpminsd_avx2(auVar232,auVar17);
  auVar109 = vmaxps_avx(auVar109,auVar102);
  auVar102 = vpminsd_avx2(auVar256,auVar275);
  uVar87 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar246._4_4_ = uVar87;
  auVar246._0_4_ = uVar87;
  auVar246._8_4_ = uVar87;
  auVar246._12_4_ = uVar87;
  auVar246._16_4_ = uVar87;
  auVar246._20_4_ = uVar87;
  auVar246._24_4_ = uVar87;
  auVar246._28_4_ = uVar87;
  auVar102 = vmaxps_avx(auVar102,auVar246);
  auVar109 = vmaxps_avx(auVar109,auVar102);
  local_3a0._4_4_ = auVar109._4_4_ * 0.99999964;
  local_3a0._0_4_ = auVar109._0_4_ * 0.99999964;
  local_3a0._8_4_ = auVar109._8_4_ * 0.99999964;
  local_3a0._12_4_ = auVar109._12_4_ * 0.99999964;
  local_3a0._16_4_ = auVar109._16_4_ * 0.99999964;
  local_3a0._20_4_ = auVar109._20_4_ * 0.99999964;
  local_3a0._24_4_ = auVar109._24_4_ * 0.99999964;
  local_3a0._28_4_ = auVar109._28_4_;
  auVar109 = vpmaxsd_avx2(auVar16,auVar164);
  auVar102 = vpmaxsd_avx2(auVar232,auVar17);
  auVar109 = vminps_avx(auVar109,auVar102);
  auVar102 = vpmaxsd_avx2(auVar256,auVar275);
  fVar116 = (ray->super_RayK<1>).tfar;
  auVar162._4_4_ = fVar116;
  auVar162._0_4_ = fVar116;
  auVar162._8_4_ = fVar116;
  auVar162._12_4_ = fVar116;
  auVar162._16_4_ = fVar116;
  auVar162._20_4_ = fVar116;
  auVar162._24_4_ = fVar116;
  auVar162._28_4_ = fVar116;
  auVar102 = vminps_avx(auVar102,auVar162);
  auVar109 = vminps_avx(auVar109,auVar102);
  auVar15._4_4_ = auVar109._4_4_ * 1.0000004;
  auVar15._0_4_ = auVar109._0_4_ * 1.0000004;
  auVar15._8_4_ = auVar109._8_4_ * 1.0000004;
  auVar15._12_4_ = auVar109._12_4_ * 1.0000004;
  auVar15._16_4_ = auVar109._16_4_ * 1.0000004;
  auVar15._20_4_ = auVar109._20_4_ * 1.0000004;
  auVar15._24_4_ = auVar109._24_4_ * 1.0000004;
  auVar15._28_4_ = auVar109._28_4_;
  auVar109._1_3_ = 0;
  auVar109[0] = PVar6;
  auVar109[4] = PVar6;
  auVar109._5_3_ = 0;
  auVar109[8] = PVar6;
  auVar109._9_3_ = 0;
  auVar109[0xc] = PVar6;
  auVar109._13_3_ = 0;
  auVar109[0x10] = PVar6;
  auVar109._17_3_ = 0;
  auVar109[0x14] = PVar6;
  auVar109._21_3_ = 0;
  auVar109[0x18] = PVar6;
  auVar109._25_3_ = 0;
  auVar109[0x1c] = PVar6;
  auVar109._29_3_ = 0;
  auVar102 = vpcmpgtd_avx2(auVar109,_DAT_0205a920);
  auVar109 = vcmpps_avx(local_3a0,auVar15,2);
  auVar109 = vandps_avx(auVar109,auVar102);
  uVar83 = vmovmskps_avx(auVar109);
  if (uVar83 == 0) {
    return;
  }
  uVar83 = uVar83 & 0xff;
  auVar102._16_16_ = mm_lookupmask_ps._240_16_;
  auVar102._0_16_ = mm_lookupmask_ps._240_16_;
  local_380 = vblendps_avx(auVar102,ZEXT832(0) << 0x20,0x80);
LAB_01920cee:
  uVar88 = (ulong)uVar83;
  local_7a8 = uVar88;
  lVar89 = 0;
  for (; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x8000000000000000) {
    lVar89 = lVar89 + 1;
  }
  local_ae8 = (ulong)*(uint *)(local_7b0 + 2);
  pGVar7 = (context->scene->geometries).items[*(uint *)(local_7b0 + 2)].ptr;
  local_a78 = (ulong)*(uint *)(local_7b0 + lVar89 * 4 + 6);
  uVar88 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)*(uint *)(local_7b0 + lVar89 * 4 + 6) *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar116 = (pGVar7->time_range).lower;
  fVar116 = pGVar7->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar116) /
            ((pGVar7->time_range).upper - fVar116));
  auVar99 = vroundss_avx(ZEXT416((uint)fVar116),ZEXT416((uint)fVar116),9);
  auVar99 = vminss_avx(auVar99,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar99 = vmaxss_avx(ZEXT816(0) << 0x20,auVar99);
  fVar116 = fVar116 - auVar99._0_4_;
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar86 = (long)(int)auVar99._0_4_ * 0x38;
  lVar89 = *(long *)(_Var8 + 0x10 + lVar86);
  lVar9 = *(long *)(_Var8 + 0x38 + lVar86);
  lVar10 = *(long *)(_Var8 + 0x48 + lVar86);
  pfVar1 = (float *)(lVar9 + uVar88 * lVar10);
  auVar117._0_4_ = fVar116 * *pfVar1;
  auVar117._4_4_ = fVar116 * pfVar1[1];
  auVar117._8_4_ = fVar116 * pfVar1[2];
  auVar117._12_4_ = fVar116 * pfVar1[3];
  pfVar1 = (float *)(lVar9 + (uVar88 + 1) * lVar10);
  auVar155._0_4_ = fVar116 * *pfVar1;
  auVar155._4_4_ = fVar116 * pfVar1[1];
  auVar155._8_4_ = fVar116 * pfVar1[2];
  auVar155._12_4_ = fVar116 * pfVar1[3];
  pfVar1 = (float *)(lVar9 + (uVar88 + 2) * lVar10);
  auVar196._0_4_ = fVar116 * *pfVar1;
  auVar196._4_4_ = fVar116 * pfVar1[1];
  auVar196._8_4_ = fVar116 * pfVar1[2];
  auVar196._12_4_ = fVar116 * pfVar1[3];
  pfVar1 = (float *)(lVar9 + lVar10 * (uVar88 + 3));
  auVar174._0_4_ = fVar116 * *pfVar1;
  auVar174._4_4_ = fVar116 * pfVar1[1];
  auVar174._8_4_ = fVar116 * pfVar1[2];
  auVar174._12_4_ = fVar116 * pfVar1[3];
  lVar9 = *(long *)(_Var8 + lVar86);
  fVar116 = 1.0 - fVar116;
  auVar93._4_4_ = fVar116;
  auVar93._0_4_ = fVar116;
  auVar93._8_4_ = fVar116;
  auVar93._12_4_ = fVar116;
  auVar124 = vfmadd231ps_fma(auVar117,auVar93,*(undefined1 (*) [16])(lVar9 + lVar89 * uVar88));
  auVar4 = vfmadd231ps_fma(auVar155,auVar93,*(undefined1 (*) [16])(lVar9 + lVar89 * (uVar88 + 1)));
  auVar272 = vfmadd231ps_fma(auVar196,auVar93,*(undefined1 (*) [16])(lVar9 + lVar89 * (uVar88 + 2)))
  ;
  auVar5 = vfmadd231ps_fma(auVar174,auVar93,*(undefined1 (*) [16])(lVar9 + lVar89 * (uVar88 + 3)));
  auVar217._0_4_ = (auVar124._0_4_ + auVar4._0_4_ + auVar272._0_4_ + auVar5._0_4_) * 0.25;
  auVar217._4_4_ = (auVar124._4_4_ + auVar4._4_4_ + auVar272._4_4_ + auVar5._4_4_) * 0.25;
  auVar217._8_4_ = (auVar124._8_4_ + auVar4._8_4_ + auVar272._8_4_ + auVar5._8_4_) * 0.25;
  auVar217._12_4_ = (auVar124._12_4_ + auVar4._12_4_ + auVar272._12_4_ + auVar5._12_4_) * 0.25;
  aVar2 = (ray->super_RayK<1>).org.field_0;
  aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar99 = vsubps_avx(auVar217,(undefined1  [16])aVar2);
  auVar99 = vdpps_avx(auVar99,(undefined1  [16])aVar3,0x7f);
  auVar198 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
  auVar222 = vrcpss_avx(auVar198,auVar198);
  auVar249 = ZEXT1664(auVar222);
  auVar198 = vfnmadd213ss_fma(auVar222,auVar198,ZEXT416(0x40000000));
  auVar254 = ZEXT1664(auVar198);
  fVar116 = auVar222._0_4_ * auVar198._0_4_;
  auVar240 = ZEXT464((uint)fVar116);
  fVar116 = auVar99._0_4_ * fVar116;
  local_7c0 = ZEXT416((uint)fVar116);
  auVar218._4_4_ = fVar116;
  auVar218._0_4_ = fVar116;
  auVar218._8_4_ = fVar116;
  auVar218._12_4_ = fVar116;
  fStack_750 = fVar116;
  _local_760 = auVar218;
  fStack_74c = fVar116;
  fStack_748 = fVar116;
  fStack_744 = fVar116;
  auVar99 = vfmadd231ps_fma((undefined1  [16])aVar2,(undefined1  [16])aVar3,auVar218);
  auVar99 = vblendps_avx(auVar99,_DAT_01feba10,8);
  local_9e0 = vsubps_avx(auVar124,auVar99);
  local_9f0 = vsubps_avx(auVar272,auVar99);
  auVar210 = ZEXT1664(local_9f0);
  local_a00 = vsubps_avx(auVar4,auVar99);
  _local_a10 = vsubps_avx(auVar5,auVar99);
  auVar194 = ZEXT1664(_local_a10);
  auVar99 = vmovshdup_avx(local_9e0);
  local_1a0 = auVar99._0_8_;
  uStack_198 = local_1a0;
  uStack_190 = local_1a0;
  uStack_188 = local_1a0;
  auVar99 = vshufps_avx(local_9e0,local_9e0,0xaa);
  local_1c0 = auVar99._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar99 = vshufps_avx(local_9e0,local_9e0,0xff);
  local_1e0 = auVar99._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar99 = vmovshdup_avx(local_a00);
  local_200 = auVar99._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar99 = vshufps_avx(local_a00,local_a00,0xaa);
  local_220 = auVar99._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar99 = vshufps_avx(local_a00,local_a00,0xff);
  local_240 = auVar99._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar99 = vmovshdup_avx(local_9f0);
  local_440 = auVar99._0_4_;
  fStack_43c = auVar99._4_4_;
  auVar99 = vshufps_avx(local_9f0,local_9f0,0xaa);
  local_460 = auVar99._0_4_;
  fStack_45c = auVar99._4_4_;
  auVar99 = vshufps_avx(local_9f0,local_9f0,0xff);
  local_260 = auVar99._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar99 = vmovshdup_avx(_local_a10);
  local_280 = auVar99._0_8_;
  uStack_278 = local_280;
  uStack_270 = local_280;
  uStack_268 = local_280;
  auVar99 = vshufps_avx(_local_a10,_local_a10,0xaa);
  local_2a0 = auVar99._0_8_;
  uStack_298 = local_2a0;
  uStack_290 = local_2a0;
  uStack_288 = local_2a0;
  auVar99 = vshufps_avx(_local_a10,_local_a10,0xff);
  local_2c0 = auVar99._0_8_;
  uStack_2b8 = local_2c0;
  uStack_2b0 = local_2c0;
  uStack_2a8 = local_2c0;
  auVar94._0_4_ = aVar3.x * aVar3.x;
  auVar94._4_4_ = aVar3.y * aVar3.y;
  auVar94._8_4_ = aVar3.z * aVar3.z;
  auVar94._12_4_ = aVar3.field_3.w * aVar3.field_3.w;
  auVar99 = vshufps_avx(auVar94,auVar94,0xaa);
  auVar103._0_8_ = auVar99._0_8_;
  auVar103._8_8_ = auVar103._0_8_;
  auVar103._16_8_ = auVar103._0_8_;
  auVar103._24_8_ = auVar103._0_8_;
  uVar87 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_600._4_4_ = uVar87;
  local_600._0_4_ = uVar87;
  fStack_5f8 = (float)uVar87;
  fStack_5f4 = (float)uVar87;
  fStack_5f0 = (float)uVar87;
  fStack_5ec = (float)uVar87;
  fStack_5e8 = (float)uVar87;
  register0x0000125c = uVar87;
  uVar87 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  local_620._4_4_ = uVar87;
  local_620._0_4_ = uVar87;
  fStack_618 = (float)uVar87;
  fStack_614 = (float)uVar87;
  fStack_610 = (float)uVar87;
  fStack_60c = (float)uVar87;
  fStack_608 = (float)uVar87;
  register0x0000135c = uVar87;
  auVar229 = ZEXT3264(_local_620);
  auVar99 = vfmadd231ps_fma(auVar103,_local_620,_local_620);
  auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),_local_600,_local_600);
  uVar88 = 1;
  uVar84 = 0;
  local_640 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_63c = local_640;
  fStack_638 = local_640;
  fStack_634 = local_640;
  fStack_630 = local_640;
  fStack_62c = local_640;
  fStack_628 = local_640;
  fStack_624 = local_640;
  local_300 = local_9e0._0_4_;
  uStack_2fc = local_300;
  uStack_2f8 = local_300;
  uStack_2f4 = local_300;
  uStack_2f0 = local_300;
  uStack_2ec = local_300;
  uStack_2e8 = local_300;
  uStack_2e4 = local_300;
  local_320 = local_a00._0_4_;
  fStack_31c = local_320;
  fStack_318 = local_320;
  fStack_314 = local_320;
  fStack_310 = local_320;
  fStack_30c = local_320;
  fStack_308 = local_320;
  fStack_304 = local_320;
  local_340 = local_9f0._0_4_;
  fStack_33c = local_340;
  fStack_338 = local_340;
  fStack_334 = local_340;
  fStack_330 = local_340;
  fStack_32c = local_340;
  fStack_328 = local_340;
  fStack_324 = local_340;
  local_360 = local_a10._0_4_;
  fStack_35c = local_360;
  fStack_358 = local_360;
  fStack_354 = local_360;
  fStack_350 = local_360;
  fStack_34c = local_360;
  fStack_348 = local_360;
  fStack_344 = local_360;
  local_2e0 = ZEXT1632(auVar99);
  local_480 = vandps_avx(ZEXT1632(auVar99),local_7a0);
  local_7d0 = 0x3f80000000000000;
  uStack_7c8 = 0;
  fStack_458 = local_460;
  fStack_454 = fStack_45c;
  fStack_450 = local_460;
  fStack_44c = fStack_45c;
  fStack_448 = local_460;
  fStack_444 = fStack_45c;
  fStack_438 = local_440;
  fStack_434 = fStack_43c;
  fStack_430 = local_440;
  fStack_42c = fStack_43c;
  fStack_428 = local_440;
  fStack_424 = fStack_43c;
  do {
    auVar69._8_8_ = uStack_7c8;
    auVar69._0_8_ = local_7d0;
    auVar99 = vmovshdup_avx(auVar69);
    local_980._0_4_ = (undefined4)local_7d0;
    fVar116 = auVar99._0_4_ - (float)local_980._0_4_;
    fVar152 = fVar116 * 0.04761905;
    local_980._4_4_ = (float)local_980._0_4_;
    local_980._8_4_ = (float)local_980._0_4_;
    local_980._12_4_ = (float)local_980._0_4_;
    local_980._16_4_ = local_980._0_4_;
    local_980._20_4_ = local_980._0_4_;
    local_980._24_4_ = local_980._0_4_;
    local_980._28_4_ = local_980._0_4_;
    local_860._4_4_ = fVar116;
    local_860._0_4_ = fVar116;
    local_860._8_4_ = fVar116;
    local_860._12_4_ = fVar116;
    local_860._16_4_ = fVar116;
    local_860._20_4_ = fVar116;
    local_860._24_4_ = fVar116;
    local_860._28_4_ = fVar116;
    auVar99 = vfmadd231ps_fma(local_980,local_860,_DAT_02020f20);
    auVar290._8_4_ = 0x3f800000;
    auVar290._0_8_ = &DAT_3f8000003f800000;
    auVar290._12_4_ = 0x3f800000;
    auVar290._16_4_ = 0x3f800000;
    auVar290._20_4_ = 0x3f800000;
    auVar290._24_4_ = 0x3f800000;
    auVar290._28_4_ = 0x3f800000;
    auVar109 = vsubps_avx(auVar290,ZEXT1632(auVar99));
    auVar74._4_4_ = fStack_31c;
    auVar74._0_4_ = local_320;
    auVar74._8_4_ = fStack_318;
    auVar74._12_4_ = fStack_314;
    auVar74._16_4_ = fStack_310;
    auVar74._20_4_ = fStack_30c;
    auVar74._24_4_ = fStack_308;
    auVar74._28_4_ = fStack_304;
    fVar116 = auVar99._0_4_;
    auVar267._0_4_ = local_320 * fVar116;
    fVar91 = auVar99._4_4_;
    auVar267._4_4_ = fStack_31c * fVar91;
    fVar147 = auVar99._8_4_;
    auVar267._8_4_ = fStack_318 * fVar147;
    fVar281 = auVar99._12_4_;
    auVar267._12_4_ = fStack_314 * fVar281;
    auVar267._16_4_ = fStack_310 * 0.0;
    auVar267._20_4_ = fStack_30c * 0.0;
    auVar267._28_36_ = auVar266._28_36_;
    auVar267._24_4_ = fStack_308 * 0.0;
    auVar79._8_8_ = uStack_1f8;
    auVar79._0_8_ = local_200;
    auVar79._16_8_ = uStack_1f0;
    auVar79._24_8_ = uStack_1e8;
    auVar259._0_4_ = (float)local_200 * fVar116;
    auVar259._4_4_ = (float)((ulong)local_200 >> 0x20) * fVar91;
    auVar259._8_4_ = (float)uStack_1f8 * fVar147;
    auVar259._12_4_ = (float)((ulong)uStack_1f8 >> 0x20) * fVar281;
    auVar259._16_4_ = (float)uStack_1f0 * 0.0;
    auVar259._20_4_ = (float)((ulong)uStack_1f0 >> 0x20) * 0.0;
    auVar259._28_36_ = auVar258._28_36_;
    auVar259._24_4_ = (float)uStack_1e8 * 0.0;
    auVar78._8_8_ = uStack_218;
    auVar78._0_8_ = local_220;
    auVar78._16_8_ = uStack_210;
    auVar78._24_8_ = uStack_208;
    auVar255._0_4_ = (float)local_220 * fVar116;
    auVar255._4_4_ = (float)((ulong)local_220 >> 0x20) * fVar91;
    auVar255._8_4_ = (float)uStack_218 * fVar147;
    auVar255._12_4_ = (float)((ulong)uStack_218 >> 0x20) * fVar281;
    auVar255._16_4_ = (float)uStack_210 * 0.0;
    auVar255._20_4_ = (float)((ulong)uStack_210 >> 0x20) * 0.0;
    auVar255._28_36_ = auVar254._28_36_;
    auVar255._24_4_ = (float)uStack_208 * 0.0;
    auVar77._8_8_ = uStack_238;
    auVar77._0_8_ = local_240;
    auVar77._16_8_ = uStack_230;
    auVar77._24_8_ = uStack_228;
    auVar254._0_4_ = (float)local_240 * fVar116;
    auVar254._4_4_ = (float)((ulong)local_240 >> 0x20) * fVar91;
    auVar254._8_4_ = (float)uStack_238 * fVar147;
    auVar254._12_4_ = (float)((ulong)uStack_238 >> 0x20) * fVar281;
    auVar254._16_4_ = (float)uStack_230 * 0.0;
    auVar254._20_4_ = (float)((ulong)uStack_230 >> 0x20) * 0.0;
    auVar254._28_36_ = auVar240._28_36_;
    auVar254._24_4_ = (float)uStack_228 * 0.0;
    auVar75._4_4_ = uStack_2fc;
    auVar75._0_4_ = local_300;
    auVar75._8_4_ = uStack_2f8;
    auVar75._12_4_ = uStack_2f4;
    auVar75._16_4_ = uStack_2f0;
    auVar75._20_4_ = uStack_2ec;
    auVar75._24_4_ = uStack_2e8;
    auVar75._28_4_ = uStack_2e4;
    auVar99 = vfmadd231ps_fma(auVar267._0_32_,auVar109,auVar75);
    auVar82._8_8_ = uStack_198;
    auVar82._0_8_ = local_1a0;
    auVar82._16_8_ = uStack_190;
    auVar82._24_8_ = uStack_188;
    auVar198 = vfmadd231ps_fma(auVar259._0_32_,auVar109,auVar82);
    auVar81._8_8_ = uStack_1b8;
    auVar81._0_8_ = local_1c0;
    auVar81._16_8_ = uStack_1b0;
    auVar81._24_8_ = uStack_1a8;
    auVar222 = vfmadd231ps_fma(auVar255._0_32_,auVar109,auVar81);
    auVar80._8_8_ = uStack_1d8;
    auVar80._0_8_ = local_1e0;
    auVar80._16_8_ = uStack_1d0;
    auVar80._24_8_ = uStack_1c8;
    auVar124 = vfmadd231ps_fma(auVar254._0_32_,auVar109,auVar80);
    auVar73._4_4_ = fStack_33c;
    auVar73._0_4_ = local_340;
    auVar73._8_4_ = fStack_338;
    auVar73._12_4_ = fStack_334;
    auVar73._16_4_ = fStack_330;
    auVar73._20_4_ = fStack_32c;
    auVar73._24_4_ = fStack_328;
    auVar73._28_4_ = fStack_324;
    auVar250._0_4_ = local_340 * fVar116;
    auVar250._4_4_ = fStack_33c * fVar91;
    auVar250._8_4_ = fStack_338 * fVar147;
    auVar250._12_4_ = fStack_334 * fVar281;
    auVar250._16_4_ = fStack_330 * 0.0;
    auVar250._20_4_ = fStack_32c * 0.0;
    auVar250._28_36_ = auVar249._28_36_;
    auVar250._24_4_ = fStack_328 * 0.0;
    auVar240._0_4_ = fVar116 * local_440;
    auVar240._4_4_ = fVar91 * fStack_43c;
    auVar240._8_4_ = fVar147 * fStack_438;
    auVar240._12_4_ = fVar281 * fStack_434;
    auVar240._16_4_ = fStack_430 * 0.0;
    auVar240._20_4_ = fStack_42c * 0.0;
    auVar240._28_36_ = auVar229._28_36_;
    auVar240._24_4_ = fStack_428 * 0.0;
    auVar229._0_4_ = fVar116 * local_460;
    auVar229._4_4_ = fVar91 * fStack_45c;
    auVar229._8_4_ = fVar147 * fStack_458;
    auVar229._12_4_ = fVar281 * fStack_454;
    auVar229._16_4_ = fStack_450 * 0.0;
    auVar229._20_4_ = fStack_44c * 0.0;
    auVar229._28_36_ = auVar210._28_36_;
    auVar229._24_4_ = fStack_448 * 0.0;
    auVar76._8_8_ = uStack_258;
    auVar76._0_8_ = local_260;
    auVar76._16_8_ = uStack_250;
    auVar76._24_8_ = uStack_248;
    auVar210._0_4_ = (float)local_260 * fVar116;
    auVar210._4_4_ = (float)((ulong)local_260 >> 0x20) * fVar91;
    auVar210._8_4_ = (float)uStack_258 * fVar147;
    auVar210._12_4_ = (float)((ulong)uStack_258 >> 0x20) * fVar281;
    auVar210._16_4_ = (float)uStack_250 * 0.0;
    auVar210._20_4_ = (float)((ulong)uStack_250 >> 0x20) * 0.0;
    auVar210._28_36_ = auVar194._28_36_;
    auVar210._24_4_ = (float)uStack_248 * 0.0;
    auVar4 = vfmadd231ps_fma(auVar250._0_32_,auVar109,auVar74);
    auVar272 = vfmadd231ps_fma(auVar240._0_32_,auVar109,auVar79);
    auVar5 = vfmadd231ps_fma(auVar229._0_32_,auVar109,auVar78);
    auVar133 = vfmadd231ps_fma(auVar210._0_32_,auVar109,auVar77);
    auVar19._4_4_ = fVar91 * fStack_35c;
    auVar19._0_4_ = fVar116 * local_360;
    auVar19._8_4_ = fVar147 * fStack_358;
    auVar19._12_4_ = fVar281 * fStack_354;
    auVar19._16_4_ = fStack_350 * 0.0;
    auVar19._20_4_ = fStack_34c * 0.0;
    auVar19._24_4_ = fStack_348 * 0.0;
    auVar19._28_4_ = (int)((ulong)uStack_228 >> 0x20);
    auVar20._4_4_ = fVar91 * local_280._4_4_;
    auVar20._0_4_ = fVar116 * (float)local_280;
    auVar20._8_4_ = fVar147 * (float)uStack_278;
    auVar20._12_4_ = fVar281 * uStack_278._4_4_;
    auVar20._16_4_ = (float)uStack_270 * 0.0;
    auVar20._20_4_ = uStack_270._4_4_ * 0.0;
    auVar20._24_4_ = (float)uStack_268 * 0.0;
    auVar20._28_4_ = (int)((ulong)uStack_208 >> 0x20);
    auVar21._28_4_ = (int)((ulong)uStack_1e8 >> 0x20);
    auVar21._0_28_ =
         ZEXT1628(CONCAT412(auVar4._12_4_ * fVar281,
                            CONCAT48(auVar4._8_4_ * fVar147,
                                     CONCAT44(auVar4._4_4_ * fVar91,auVar4._0_4_ * fVar116))));
    auVar99 = vfmadd231ps_fma(auVar21,auVar109,ZEXT1632(auVar99));
    auVar198 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar281 * auVar272._12_4_,
                                                  CONCAT48(fVar147 * auVar272._8_4_,
                                                           CONCAT44(fVar91 * auVar272._4_4_,
                                                                    fVar116 * auVar272._0_4_)))),
                               auVar109,ZEXT1632(auVar198));
    auVar222 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar281 * auVar5._12_4_,
                                                  CONCAT48(fVar147 * auVar5._8_4_,
                                                           CONCAT44(fVar91 * auVar5._4_4_,
                                                                    fVar116 * auVar5._0_4_)))),
                               auVar109,ZEXT1632(auVar222));
    auVar124 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar281 * auVar133._12_4_,
                                                  CONCAT48(fVar147 * auVar133._8_4_,
                                                           CONCAT44(fVar91 * auVar133._4_4_,
                                                                    fVar116 * auVar133._0_4_)))),
                               auVar109,ZEXT1632(auVar124));
    auVar237._0_4_ = fVar116 * (float)local_2a0;
    auVar237._4_4_ = fVar91 * local_2a0._4_4_;
    auVar237._8_4_ = fVar147 * (float)uStack_298;
    auVar237._12_4_ = fVar281 * uStack_298._4_4_;
    auVar237._16_4_ = (float)uStack_290 * 0.0;
    auVar237._20_4_ = uStack_290._4_4_ * 0.0;
    auVar237._24_4_ = (float)uStack_288 * 0.0;
    auVar237._28_4_ = 0;
    auVar159 = vfmadd231ps_fma(auVar19,auVar109,auVar73);
    auVar4 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar159._12_4_ * fVar281,
                                                CONCAT48(auVar159._8_4_ * fVar147,
                                                         CONCAT44(auVar159._4_4_ * fVar91,
                                                                  auVar159._0_4_ * fVar116)))),
                             auVar109,ZEXT1632(auVar4));
    auVar247._0_4_ = fVar116 * (float)local_2c0;
    auVar247._4_4_ = fVar91 * local_2c0._4_4_;
    auVar247._8_4_ = fVar147 * (float)uStack_2b8;
    auVar247._12_4_ = fVar281 * uStack_2b8._4_4_;
    auVar247._16_4_ = (float)uStack_2b0 * 0.0;
    auVar247._20_4_ = uStack_2b0._4_4_ * 0.0;
    auVar247._24_4_ = (float)uStack_2a8 * 0.0;
    auVar247._28_4_ = 0;
    auVar72._4_4_ = fStack_43c;
    auVar72._0_4_ = local_440;
    auVar72._8_4_ = fStack_438;
    auVar72._12_4_ = fStack_434;
    auVar72._16_4_ = fStack_430;
    auVar72._20_4_ = fStack_42c;
    auVar72._24_4_ = fStack_428;
    auVar72._28_4_ = fStack_424;
    auVar159 = vfmadd231ps_fma(auVar20,auVar109,auVar72);
    auVar71._4_4_ = fStack_45c;
    auVar71._0_4_ = local_460;
    auVar71._8_4_ = fStack_458;
    auVar71._12_4_ = fStack_454;
    auVar71._16_4_ = fStack_450;
    auVar71._20_4_ = fStack_44c;
    auVar71._24_4_ = fStack_448;
    auVar71._28_4_ = fStack_444;
    auVar92 = vfmadd231ps_fma(auVar237,auVar109,auVar71);
    auVar154 = vfmadd231ps_fma(auVar247,auVar109,auVar76);
    auVar22._28_4_ = fStack_324;
    auVar22._0_28_ =
         ZEXT1628(CONCAT412(auVar154._12_4_ * fVar281,
                            CONCAT48(auVar154._8_4_ * fVar147,
                                     CONCAT44(auVar154._4_4_ * fVar91,auVar154._0_4_ * fVar116))));
    auVar272 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar159._12_4_ * fVar281,
                                                  CONCAT48(auVar159._8_4_ * fVar147,
                                                           CONCAT44(auVar159._4_4_ * fVar91,
                                                                    auVar159._0_4_ * fVar116)))),
                               auVar109,ZEXT1632(auVar272));
    auVar5 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar281 * auVar92._12_4_,
                                                CONCAT48(fVar147 * auVar92._8_4_,
                                                         CONCAT44(fVar91 * auVar92._4_4_,
                                                                  fVar116 * auVar92._0_4_)))),
                             auVar109,ZEXT1632(auVar5));
    auVar133 = vfmadd231ps_fma(auVar22,auVar109,ZEXT1632(auVar133));
    auVar23._28_4_ = fStack_304;
    auVar23._0_28_ =
         ZEXT1628(CONCAT412(auVar272._12_4_ * fVar281,
                            CONCAT48(auVar272._8_4_ * fVar147,
                                     CONCAT44(auVar272._4_4_ * fVar91,auVar272._0_4_ * fVar116))));
    auVar24._28_4_ = (int)((ulong)uStack_248 >> 0x20);
    auVar24._0_28_ =
         ZEXT1628(CONCAT412(fVar281 * auVar5._12_4_,
                            CONCAT48(fVar147 * auVar5._8_4_,
                                     CONCAT44(fVar91 * auVar5._4_4_,fVar116 * auVar5._0_4_))));
    auVar159 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar4._12_4_ * fVar281,
                                                  CONCAT48(auVar4._8_4_ * fVar147,
                                                           CONCAT44(auVar4._4_4_ * fVar91,
                                                                    auVar4._0_4_ * fVar116)))),
                               auVar109,ZEXT1632(auVar99));
    auVar92 = vfmadd231ps_fma(auVar23,auVar109,ZEXT1632(auVar198));
    local_ae0 = ZEXT1632(auVar92);
    auVar92 = vfmadd231ps_fma(auVar24,auVar109,ZEXT1632(auVar222));
    auVar154 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar133._12_4_ * fVar281,
                                                  CONCAT48(auVar133._8_4_ * fVar147,
                                                           CONCAT44(auVar133._4_4_ * fVar91,
                                                                    auVar133._0_4_ * fVar116)))),
                               ZEXT1632(auVar124),auVar109);
    auVar102 = vsubps_avx(ZEXT1632(auVar4),ZEXT1632(auVar99));
    auVar109 = vsubps_avx(ZEXT1632(auVar272),ZEXT1632(auVar198));
    auVar145 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar222));
    auVar16 = vsubps_avx(ZEXT1632(auVar133),ZEXT1632(auVar124));
    local_820._0_4_ = fVar152 * auVar102._0_4_ * 3.0;
    local_820._4_4_ = fVar152 * auVar102._4_4_ * 3.0;
    local_820._8_4_ = fVar152 * auVar102._8_4_ * 3.0;
    local_820._12_4_ = fVar152 * auVar102._12_4_ * 3.0;
    local_820._16_4_ = fVar152 * auVar102._16_4_ * 3.0;
    local_820._20_4_ = fVar152 * auVar102._20_4_ * 3.0;
    local_820._24_4_ = fVar152 * auVar102._24_4_ * 3.0;
    local_820._28_4_ = 0;
    auVar251._0_4_ = fVar152 * auVar109._0_4_ * 3.0;
    auVar251._4_4_ = fVar152 * auVar109._4_4_ * 3.0;
    auVar251._8_4_ = fVar152 * auVar109._8_4_ * 3.0;
    auVar251._12_4_ = fVar152 * auVar109._12_4_ * 3.0;
    auVar251._16_4_ = fVar152 * auVar109._16_4_ * 3.0;
    auVar251._20_4_ = fVar152 * auVar109._20_4_ * 3.0;
    auVar251._24_4_ = fVar152 * auVar109._24_4_ * 3.0;
    local_940._28_4_ = 0;
    local_940._0_28_ = auVar251;
    local_880._0_4_ = fVar152 * auVar145._0_4_ * 3.0;
    local_880._4_4_ = fVar152 * auVar145._4_4_ * 3.0;
    local_880._8_4_ = fVar152 * auVar145._8_4_ * 3.0;
    local_880._12_4_ = fVar152 * auVar145._12_4_ * 3.0;
    local_880._16_4_ = fVar152 * auVar145._16_4_ * 3.0;
    local_880._20_4_ = fVar152 * auVar145._20_4_ * 3.0;
    local_880._24_4_ = fVar152 * auVar145._24_4_ * 3.0;
    local_880._28_4_ = 0;
    fVar116 = fVar152 * auVar16._0_4_ * 3.0;
    fVar147 = fVar152 * auVar16._4_4_ * 3.0;
    auVar25._4_4_ = fVar147;
    auVar25._0_4_ = fVar116;
    fVar148 = fVar152 * auVar16._8_4_ * 3.0;
    auVar25._8_4_ = fVar148;
    fVar149 = fVar152 * auVar16._12_4_ * 3.0;
    auVar25._12_4_ = fVar149;
    fVar150 = fVar152 * auVar16._16_4_ * 3.0;
    auVar25._16_4_ = fVar150;
    fVar151 = fVar152 * auVar16._20_4_ * 3.0;
    auVar25._20_4_ = fVar151;
    fVar152 = fVar152 * auVar16._24_4_ * 3.0;
    auVar25._24_4_ = fVar152;
    auVar25._28_4_ = auVar102._28_4_;
    local_ac0 = ZEXT1632(auVar159);
    local_aa0 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar159));
    _local_920 = vpermps_avx2(_DAT_0205d4a0,local_ae0);
    _local_800 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar92));
    local_680 = vsubps_avx(local_aa0,local_ac0);
    _local_580 = vsubps_avx(_local_800,ZEXT1632(auVar92));
    fVar169 = local_580._0_4_;
    fVar170 = local_580._4_4_;
    auVar26._4_4_ = fVar170 * local_820._4_4_;
    auVar26._0_4_ = fVar169 * (float)local_820._0_4_;
    fVar171 = local_580._8_4_;
    auVar26._8_4_ = fVar171 * local_820._8_4_;
    fVar172 = local_580._12_4_;
    auVar26._12_4_ = fVar172 * local_820._12_4_;
    fVar173 = local_580._16_4_;
    auVar26._16_4_ = fVar173 * local_820._16_4_;
    fVar216 = local_580._20_4_;
    auVar26._20_4_ = fVar216 * local_820._20_4_;
    fVar241 = local_580._24_4_;
    auVar26._24_4_ = fVar241 * local_820._24_4_;
    auVar26._28_4_ = local_800._28_4_;
    auVar99 = vfmsub231ps_fma(auVar26,local_880,local_680);
    _local_6a0 = vsubps_avx(_local_920,local_ae0);
    fVar261 = local_680._0_4_;
    fVar262 = local_680._4_4_;
    auVar27._4_4_ = fVar262 * auVar251._4_4_;
    auVar27._0_4_ = fVar261 * auVar251._0_4_;
    fVar280 = local_680._8_4_;
    auVar27._8_4_ = fVar280 * auVar251._8_4_;
    fVar282 = local_680._12_4_;
    auVar27._12_4_ = fVar282 * auVar251._12_4_;
    fVar283 = local_680._16_4_;
    auVar27._16_4_ = fVar283 * auVar251._16_4_;
    fVar285 = local_680._20_4_;
    auVar27._20_4_ = fVar285 * auVar251._20_4_;
    fVar286 = local_680._24_4_;
    auVar27._24_4_ = fVar286 * auVar251._24_4_;
    auVar27._28_4_ = local_aa0._28_4_;
    auVar198 = vfmsub231ps_fma(auVar27,local_820,_local_6a0);
    auVar99 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar198._12_4_ * auVar198._12_4_,
                                                 CONCAT48(auVar198._8_4_ * auVar198._8_4_,
                                                          CONCAT44(auVar198._4_4_ * auVar198._4_4_,
                                                                   auVar198._0_4_ * auVar198._0_4_))
                                                )),ZEXT1632(auVar99),ZEXT1632(auVar99));
    fVar195 = local_6a0._0_4_;
    fVar211 = local_6a0._4_4_;
    auVar28._4_4_ = fVar211 * local_880._4_4_;
    auVar28._0_4_ = fVar195 * local_880._0_4_;
    fVar212 = local_6a0._8_4_;
    auVar28._8_4_ = fVar212 * local_880._8_4_;
    fVar213 = local_6a0._12_4_;
    auVar28._12_4_ = fVar213 * local_880._12_4_;
    fVar214 = local_6a0._16_4_;
    auVar28._16_4_ = fVar214 * local_880._16_4_;
    fVar215 = local_6a0._20_4_;
    auVar28._20_4_ = fVar215 * local_880._20_4_;
    fVar260 = local_6a0._24_4_;
    auVar28._24_4_ = fVar260 * local_880._24_4_;
    auVar28._28_4_ = local_920._28_4_;
    auVar222 = vfmsub231ps_fma(auVar28,local_940,_local_580);
    auVar188._0_4_ = fVar169 * fVar169;
    auVar188._4_4_ = fVar170 * fVar170;
    auVar188._8_4_ = fVar171 * fVar171;
    auVar188._12_4_ = fVar172 * fVar172;
    auVar188._16_4_ = fVar173 * fVar173;
    auVar188._20_4_ = fVar216 * fVar216;
    auVar188._24_4_ = fVar241 * fVar241;
    auVar188._28_4_ = 0;
    auVar198 = vfmadd231ps_fma(auVar188,_local_6a0,_local_6a0);
    auVar198 = vfmadd231ps_fma(ZEXT1632(auVar198),local_680,local_680);
    auVar109 = vrcpps_avx(ZEXT1632(auVar198));
    auVar222 = vfmadd231ps_fma(ZEXT1632(auVar99),ZEXT1632(auVar222),ZEXT1632(auVar222));
    auVar269._8_4_ = 0x3f800000;
    auVar269._0_8_ = &DAT_3f8000003f800000;
    auVar269._12_4_ = 0x3f800000;
    auVar269._16_4_ = 0x3f800000;
    auVar269._20_4_ = 0x3f800000;
    auVar269._24_4_ = 0x3f800000;
    auVar269._28_4_ = 0x3f800000;
    auVar99 = vfnmadd213ps_fma(auVar109,ZEXT1632(auVar198),auVar269);
    auVar99 = vfmadd132ps_fma(ZEXT1632(auVar99),auVar109,auVar109);
    local_8a0 = vpermps_avx2(_DAT_0205d4a0,local_820);
    local_960 = vpermps_avx2(_DAT_0205d4a0,local_880);
    auVar29._4_4_ = local_8a0._4_4_ * fVar170;
    auVar29._0_4_ = local_8a0._0_4_ * fVar169;
    auVar29._8_4_ = local_8a0._8_4_ * fVar171;
    auVar29._12_4_ = local_8a0._12_4_ * fVar172;
    auVar29._16_4_ = local_8a0._16_4_ * fVar173;
    auVar29._20_4_ = local_8a0._20_4_ * fVar216;
    auVar29._24_4_ = local_8a0._24_4_ * fVar241;
    auVar29._28_4_ = auVar109._28_4_;
    auVar124 = vfmsub231ps_fma(auVar29,local_960,local_680);
    local_840 = vpermps_avx2(_DAT_0205d4a0,local_940);
    auVar30._4_4_ = fVar262 * local_840._4_4_;
    auVar30._0_4_ = fVar261 * local_840._0_4_;
    auVar30._8_4_ = fVar280 * local_840._8_4_;
    auVar30._12_4_ = fVar282 * local_840._12_4_;
    auVar30._16_4_ = fVar283 * local_840._16_4_;
    auVar30._20_4_ = fVar285 * local_840._20_4_;
    auVar30._24_4_ = fVar286 * local_840._24_4_;
    auVar30._28_4_ = 0;
    auVar4 = vfmsub231ps_fma(auVar30,local_8a0,_local_6a0);
    auVar124 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar4._12_4_ * auVar4._12_4_,
                                                  CONCAT48(auVar4._8_4_ * auVar4._8_4_,
                                                           CONCAT44(auVar4._4_4_ * auVar4._4_4_,
                                                                    auVar4._0_4_ * auVar4._0_4_)))),
                               ZEXT1632(auVar124),ZEXT1632(auVar124));
    fVar91 = local_960._0_4_;
    auVar224._0_4_ = fVar195 * fVar91;
    fVar281 = local_960._4_4_;
    auVar224._4_4_ = fVar211 * fVar281;
    fVar284 = local_960._8_4_;
    auVar224._8_4_ = fVar212 * fVar284;
    fVar287 = local_960._12_4_;
    auVar224._12_4_ = fVar213 * fVar287;
    fVar12 = local_960._16_4_;
    auVar224._16_4_ = fVar214 * fVar12;
    fVar13 = local_960._20_4_;
    auVar224._20_4_ = fVar215 * fVar13;
    fVar14 = local_960._24_4_;
    auVar224._24_4_ = fVar260 * fVar14;
    auVar224._28_4_ = 0;
    auVar17 = local_840;
    auVar4 = vfmsub231ps_fma(auVar224,local_840,_local_580);
    auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),ZEXT1632(auVar4),ZEXT1632(auVar4));
    auVar109 = vmaxps_avx(ZEXT1632(CONCAT412(auVar222._12_4_ * auVar99._12_4_,
                                             CONCAT48(auVar222._8_4_ * auVar99._8_4_,
                                                      CONCAT44(auVar222._4_4_ * auVar99._4_4_,
                                                               auVar222._0_4_ * auVar99._0_4_)))),
                          ZEXT1632(CONCAT412(auVar124._12_4_ * auVar99._12_4_,
                                             CONCAT48(auVar124._8_4_ * auVar99._8_4_,
                                                      CONCAT44(auVar124._4_4_ * auVar99._4_4_,
                                                               auVar124._0_4_ * auVar99._0_4_)))));
    local_8e0._0_4_ = auVar154._0_4_ + fVar116;
    local_8e0._4_4_ = auVar154._4_4_ + fVar147;
    local_8e0._8_4_ = auVar154._8_4_ + fVar148;
    local_8e0._12_4_ = auVar154._12_4_ + fVar149;
    local_8e0._16_4_ = fVar150 + 0.0;
    local_8e0._20_4_ = fVar151 + 0.0;
    local_8e0._24_4_ = fVar152 + 0.0;
    local_8e0._28_4_ = auVar102._28_4_ + 0.0;
    local_8c0 = ZEXT1632(auVar154);
    auVar102 = vsubps_avx(local_8c0,auVar25);
    _local_900 = vpermps_avx2(_DAT_0205d4a0,auVar102);
    local_6e0 = vpermps_avx2(_DAT_0205d4a0,local_8c0);
    auVar102 = vmaxps_avx(local_8c0,local_8e0);
    auVar145 = vmaxps_avx(_local_900,local_6e0);
    auVar16 = vrsqrtps_avx(ZEXT1632(auVar198));
    auVar102 = vmaxps_avx(auVar102,auVar145);
    fVar116 = auVar16._0_4_;
    fVar147 = auVar16._4_4_;
    fVar152 = auVar16._8_4_;
    fVar148 = auVar16._12_4_;
    fVar149 = auVar16._16_4_;
    fVar150 = auVar16._20_4_;
    fVar151 = auVar16._24_4_;
    auVar31._4_4_ = fVar147 * fVar147 * fVar147 * auVar198._4_4_ * -0.5;
    auVar31._0_4_ = fVar116 * fVar116 * fVar116 * auVar198._0_4_ * -0.5;
    auVar31._8_4_ = fVar152 * fVar152 * fVar152 * auVar198._8_4_ * -0.5;
    auVar31._12_4_ = fVar148 * fVar148 * fVar148 * auVar198._12_4_ * -0.5;
    auVar31._16_4_ = fVar149 * fVar149 * fVar149 * -0.0;
    auVar31._20_4_ = fVar150 * fVar150 * fVar150 * -0.0;
    auVar31._24_4_ = fVar151 * fVar151 * fVar151 * -0.0;
    auVar31._28_4_ = local_840._28_4_;
    auVar104._8_4_ = 0x3fc00000;
    auVar104._0_8_ = 0x3fc000003fc00000;
    auVar104._12_4_ = 0x3fc00000;
    auVar104._16_4_ = 0x3fc00000;
    auVar104._20_4_ = 0x3fc00000;
    auVar104._24_4_ = 0x3fc00000;
    auVar104._28_4_ = 0x3fc00000;
    auVar99 = vfmadd231ps_fma(auVar31,auVar104,auVar16);
    auVar254 = ZEXT1664(auVar99);
    fVar147 = auVar99._0_4_;
    fVar152 = auVar99._4_4_;
    auVar32._4_4_ = fVar211 * fVar152;
    auVar32._0_4_ = fVar195 * fVar147;
    fVar149 = auVar99._8_4_;
    auVar32._8_4_ = fVar212 * fVar149;
    fVar151 = auVar99._12_4_;
    auVar32._12_4_ = fVar213 * fVar151;
    auVar32._16_4_ = fVar214 * 0.0;
    auVar32._20_4_ = fVar215 * 0.0;
    auVar32._24_4_ = fVar260 * 0.0;
    auVar32._28_4_ = 0;
    auVar33._4_4_ = fStack_63c * fVar152 * fVar170;
    auVar33._0_4_ = local_640 * fVar147 * fVar169;
    auVar33._8_4_ = fStack_638 * fVar149 * fVar171;
    auVar33._12_4_ = fStack_634 * fVar151 * fVar172;
    auVar33._16_4_ = fStack_630 * fVar173 * 0.0;
    auVar33._20_4_ = fStack_62c * fVar216 * 0.0;
    auVar33._24_4_ = fStack_628 * fVar241 * 0.0;
    auVar33._28_4_ = local_6a0._28_4_;
    auVar99 = vfmadd231ps_fma(auVar33,auVar32,_local_620);
    local_660 = ZEXT1632(auVar92);
    auVar145 = vsubps_avx(ZEXT832(0) << 0x20,local_660);
    fVar195 = auVar145._0_4_;
    auVar274._0_4_ = fVar195 * fVar147 * fVar169;
    fVar211 = auVar145._4_4_;
    auVar274._4_4_ = fVar211 * fVar152 * fVar170;
    fVar212 = auVar145._8_4_;
    auVar274._8_4_ = fVar212 * fVar149 * fVar171;
    fVar213 = auVar145._12_4_;
    auVar274._12_4_ = fVar213 * fVar151 * fVar172;
    fVar214 = auVar145._16_4_;
    auVar274._16_4_ = fVar214 * fVar173 * 0.0;
    fVar215 = auVar145._20_4_;
    auVar274._20_4_ = fVar215 * fVar216 * 0.0;
    fVar216 = auVar145._24_4_;
    auVar274._24_4_ = fVar216 * fVar241 * 0.0;
    auVar274._28_4_ = 0;
    auVar164 = vsubps_avx(ZEXT832(0) << 0x20,local_ae0);
    auVar198 = vfmadd231ps_fma(auVar274,auVar164,auVar32);
    auVar34._4_4_ = fVar262 * fVar152;
    auVar34._0_4_ = fVar261 * fVar147;
    auVar34._8_4_ = fVar280 * fVar149;
    auVar34._12_4_ = fVar282 * fVar151;
    auVar34._16_4_ = fVar283 * 0.0;
    auVar34._20_4_ = fVar285 * 0.0;
    auVar34._24_4_ = fVar286 * 0.0;
    auVar34._28_4_ = auVar16._28_4_;
    auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar34,_local_600);
    auVar258 = ZEXT1664(auVar99);
    auVar232 = vsubps_avx(ZEXT832(0) << 0x20,local_ac0);
    auVar198 = vfmadd231ps_fma(ZEXT1632(auVar198),auVar232,auVar34);
    auVar35._4_4_ = fStack_63c * fVar211;
    auVar35._0_4_ = local_640 * fVar195;
    auVar35._8_4_ = fStack_638 * fVar212;
    auVar35._12_4_ = fStack_634 * fVar213;
    auVar35._16_4_ = fStack_630 * fVar214;
    auVar35._20_4_ = fStack_62c * fVar215;
    auVar35._24_4_ = fStack_628 * fVar216;
    auVar35._28_4_ = auVar16._28_4_;
    auVar222 = vfmadd231ps_fma(auVar35,_local_620,auVar164);
    auVar222 = vfmadd231ps_fma(ZEXT1632(auVar222),_local_600,auVar232);
    fVar116 = auVar198._0_4_;
    fVar241 = auVar99._0_4_;
    fVar148 = auVar198._4_4_;
    fVar260 = auVar99._4_4_;
    fVar150 = auVar198._8_4_;
    fVar261 = auVar99._8_4_;
    fVar169 = auVar198._12_4_;
    fVar262 = auVar99._12_4_;
    auVar16 = vsubps_avx(ZEXT1632(auVar222),
                         ZEXT1632(CONCAT412(fVar262 * fVar169,
                                            CONCAT48(fVar261 * fVar150,
                                                     CONCAT44(fVar260 * fVar148,fVar241 * fVar116)))
                                 ));
    auVar36._4_4_ = fVar211 * fVar211;
    auVar36._0_4_ = fVar195 * fVar195;
    auVar36._8_4_ = fVar212 * fVar212;
    auVar36._12_4_ = fVar213 * fVar213;
    auVar36._16_4_ = fVar214 * fVar214;
    auVar36._20_4_ = fVar215 * fVar215;
    auVar36._24_4_ = fVar216 * fVar216;
    auVar36._28_4_ = 0;
    auVar222 = vfmadd231ps_fma(auVar36,auVar164,auVar164);
    auVar222 = vfmadd231ps_fma(ZEXT1632(auVar222),auVar232,auVar232);
    auVar37._28_4_ = fStack_624;
    auVar37._0_28_ =
         ZEXT1628(CONCAT412(fVar169 * fVar169,
                            CONCAT48(fVar150 * fVar150,CONCAT44(fVar148 * fVar148,fVar116 * fVar116)
                                    )));
    local_700 = vsubps_avx(ZEXT1632(auVar222),auVar37);
    local_740 = vsqrtps_avx(auVar109);
    fVar173 = auVar102._28_4_ + local_740._28_4_;
    fVar116 = (auVar102._0_4_ + local_740._0_4_) * 1.0000002;
    fVar148 = (auVar102._4_4_ + local_740._4_4_) * 1.0000002;
    fVar150 = (auVar102._8_4_ + local_740._8_4_) * 1.0000002;
    fVar169 = (auVar102._12_4_ + local_740._12_4_) * 1.0000002;
    fVar170 = (auVar102._16_4_ + local_740._16_4_) * 1.0000002;
    fVar171 = (auVar102._20_4_ + local_740._20_4_) * 1.0000002;
    fVar172 = (auVar102._24_4_ + local_740._24_4_) * 1.0000002;
    auVar38._4_4_ = fVar148 * fVar148;
    auVar38._0_4_ = fVar116 * fVar116;
    auVar38._8_4_ = fVar150 * fVar150;
    auVar38._12_4_ = fVar169 * fVar169;
    auVar38._16_4_ = fVar170 * fVar170;
    auVar38._20_4_ = fVar171 * fVar171;
    auVar38._24_4_ = fVar172 * fVar172;
    auVar38._28_4_ = fVar173;
    fVar148 = auVar16._0_4_ + auVar16._0_4_;
    fVar150 = auVar16._4_4_ + auVar16._4_4_;
    local_a40._0_8_ = CONCAT44(fVar150,fVar148);
    local_a40._8_4_ = auVar16._8_4_ + auVar16._8_4_;
    local_a40._12_4_ = auVar16._12_4_ + auVar16._12_4_;
    local_a40._16_4_ = auVar16._16_4_ + auVar16._16_4_;
    local_a40._20_4_ = auVar16._20_4_ + auVar16._20_4_;
    local_a40._24_4_ = auVar16._24_4_ + auVar16._24_4_;
    fVar116 = auVar16._28_4_;
    local_a40._28_4_ = fVar116 + fVar116;
    auVar16 = vsubps_avx(local_700,auVar38);
    auVar256 = ZEXT1632(auVar99);
    local_5a0._28_4_ = auVar102._28_4_;
    local_5a0._0_28_ =
         ZEXT1628(CONCAT412(fVar262 * fVar262,
                            CONCAT48(fVar261 * fVar261,CONCAT44(fVar260 * fVar260,fVar241 * fVar241)
                                    )));
    local_6c0 = vsubps_avx(local_2e0,local_5a0);
    local_720._4_4_ = fVar150 * fVar150;
    local_720._0_4_ = fVar148 * fVar148;
    fStack_718 = local_a40._8_4_ * local_a40._8_4_;
    fStack_714 = local_a40._12_4_ * local_a40._12_4_;
    fStack_710 = local_a40._16_4_ * local_a40._16_4_;
    fStack_70c = local_a40._20_4_ * local_a40._20_4_;
    fStack_708 = local_a40._24_4_ * local_a40._24_4_;
    fStack_704 = fVar116;
    fVar169 = local_6c0._0_4_;
    local_780._0_4_ = fVar169 * 4.0;
    fVar170 = local_6c0._4_4_;
    local_780._4_4_ = fVar170 * 4.0;
    fVar171 = local_6c0._8_4_;
    fStack_778 = fVar171 * 4.0;
    fVar172 = local_6c0._12_4_;
    fStack_774 = fVar172 * 4.0;
    fVar241 = local_6c0._16_4_;
    fStack_770 = fVar241 * 4.0;
    fVar260 = local_6c0._20_4_;
    fStack_76c = fVar260 * 4.0;
    fVar261 = local_6c0._24_4_;
    fStack_768 = fVar261 * 4.0;
    uStack_764 = 0x40800000;
    auVar39._4_4_ = auVar16._4_4_ * (float)local_780._4_4_;
    auVar39._0_4_ = auVar16._0_4_ * (float)local_780._0_4_;
    auVar39._8_4_ = auVar16._8_4_ * fStack_778;
    auVar39._12_4_ = auVar16._12_4_ * fStack_774;
    auVar39._16_4_ = auVar16._16_4_ * fStack_770;
    auVar39._20_4_ = auVar16._20_4_ * fStack_76c;
    auVar39._24_4_ = auVar16._24_4_ * fStack_768;
    auVar39._28_4_ = fVar173;
    auVar102 = vsubps_avx(_local_720,auVar39);
    auVar109 = vcmpps_avx(auVar102,ZEXT832(0) << 0x20,5);
    auVar275 = ZEXT1632(auVar198);
    fVar116 = local_6c0._28_4_;
    if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar109 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar109 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar109 >> 0x7f,0) == '\0') &&
          (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar109 >> 0xbf,0) == '\0') &&
        (auVar109 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar109[0x1f])
    {
      auVar263._8_4_ = 0x7f800000;
      auVar263._0_8_ = 0x7f8000007f800000;
      auVar263._12_4_ = 0x7f800000;
      auVar263._16_4_ = 0x7f800000;
      auVar263._20_4_ = 0x7f800000;
      auVar263._24_4_ = 0x7f800000;
      auVar263._28_4_ = 0x7f800000;
      auVar238._8_4_ = 0xff800000;
      auVar238._0_8_ = 0xff800000ff800000;
      auVar238._12_4_ = 0xff800000;
      auVar238._16_4_ = 0xff800000;
      auVar238._20_4_ = 0xff800000;
      auVar238._24_4_ = 0xff800000;
      auVar238._28_4_ = 0xff800000;
    }
    else {
      auVar15 = vsqrtps_avx(auVar102);
      auVar264._0_4_ = fVar169 + fVar169;
      auVar264._4_4_ = fVar170 + fVar170;
      auVar264._8_4_ = fVar171 + fVar171;
      auVar264._12_4_ = fVar172 + fVar172;
      auVar264._16_4_ = fVar241 + fVar241;
      auVar264._20_4_ = fVar260 + fVar260;
      auVar264._24_4_ = fVar261 + fVar261;
      auVar264._28_4_ = fVar116 + fVar116;
      auVar190 = vrcpps_avx(auVar264);
      auVar102 = vcmpps_avx(auVar102,ZEXT432(0) << 0x20,5);
      auVar105._8_4_ = 0x3f800000;
      auVar105._0_8_ = &DAT_3f8000003f800000;
      auVar105._12_4_ = 0x3f800000;
      auVar105._16_4_ = 0x3f800000;
      auVar105._20_4_ = 0x3f800000;
      auVar105._24_4_ = 0x3f800000;
      auVar105._28_4_ = 0x3f800000;
      auVar99 = vfnmadd213ps_fma(auVar264,auVar190,auVar105);
      auVar99 = vfmadd132ps_fma(ZEXT1632(auVar99),auVar190,auVar190);
      auVar106._0_8_ = CONCAT44(fVar150,fVar148) ^ 0x8000000080000000;
      auVar106._8_4_ = -local_a40._8_4_;
      auVar106._12_4_ = -local_a40._12_4_;
      auVar106._16_4_ = -local_a40._16_4_;
      auVar106._20_4_ = -local_a40._20_4_;
      auVar106._24_4_ = -local_a40._24_4_;
      auVar106._28_4_ = -local_a40._28_4_;
      auVar161 = vsubps_avx(auVar106,auVar15);
      auVar40._4_4_ = auVar99._4_4_ * auVar161._4_4_;
      auVar40._0_4_ = auVar99._0_4_ * auVar161._0_4_;
      auVar40._8_4_ = auVar99._8_4_ * auVar161._8_4_;
      auVar40._12_4_ = auVar99._12_4_ * auVar161._12_4_;
      auVar40._16_4_ = auVar161._16_4_ * 0.0;
      auVar40._20_4_ = auVar161._20_4_ * 0.0;
      auVar40._24_4_ = auVar161._24_4_ * 0.0;
      auVar40._28_4_ = auVar161._28_4_;
      auVar15 = vsubps_avx(auVar15,local_a40);
      auVar41._4_4_ = auVar99._4_4_ * auVar15._4_4_;
      auVar41._0_4_ = auVar99._0_4_ * auVar15._0_4_;
      auVar41._8_4_ = auVar99._8_4_ * auVar15._8_4_;
      auVar41._12_4_ = auVar99._12_4_ * auVar15._12_4_;
      auVar41._16_4_ = auVar15._16_4_ * 0.0;
      auVar41._20_4_ = auVar15._20_4_ * 0.0;
      auVar41._24_4_ = auVar15._24_4_ * 0.0;
      auVar41._28_4_ = auVar190._28_4_;
      auVar99 = vfmadd213ps_fma(auVar256,auVar40,auVar275);
      local_540 = ZEXT1632(CONCAT412(fVar151 * auVar99._12_4_,
                                     CONCAT48(fVar149 * auVar99._8_4_,
                                              CONCAT44(fVar152 * auVar99._4_4_,
                                                       fVar147 * auVar99._0_4_))));
      auVar99 = vfmadd213ps_fma(auVar256,auVar41,auVar275);
      local_560 = ZEXT1632(CONCAT412(fVar151 * auVar99._12_4_,
                                     CONCAT48(fVar149 * auVar99._8_4_,
                                              CONCAT44(fVar152 * auVar99._4_4_,
                                                       fVar147 * auVar99._0_4_))));
      auVar231._8_4_ = 0x7f800000;
      auVar231._0_8_ = 0x7f8000007f800000;
      auVar231._12_4_ = 0x7f800000;
      auVar231._16_4_ = 0x7f800000;
      auVar231._20_4_ = 0x7f800000;
      auVar231._24_4_ = 0x7f800000;
      auVar231._28_4_ = 0x7f800000;
      auVar263 = vblendvps_avx(auVar231,auVar40,auVar102);
      auVar190 = vandps_avx(local_5a0,local_7a0);
      auVar190 = vmaxps_avx(local_480,auVar190);
      auVar42._4_4_ = auVar190._4_4_ * 1.9073486e-06;
      auVar42._0_4_ = auVar190._0_4_ * 1.9073486e-06;
      auVar42._8_4_ = auVar190._8_4_ * 1.9073486e-06;
      auVar42._12_4_ = auVar190._12_4_ * 1.9073486e-06;
      auVar42._16_4_ = auVar190._16_4_ * 1.9073486e-06;
      auVar42._20_4_ = auVar190._20_4_ * 1.9073486e-06;
      auVar42._24_4_ = auVar190._24_4_ * 1.9073486e-06;
      auVar42._28_4_ = auVar190._28_4_;
      auVar190 = vandps_avx(local_6c0,local_7a0);
      auVar190 = vcmpps_avx(auVar190,auVar42,1);
      auVar107._8_4_ = 0xff800000;
      auVar107._0_8_ = 0xff800000ff800000;
      auVar107._12_4_ = 0xff800000;
      auVar107._16_4_ = 0xff800000;
      auVar107._20_4_ = 0xff800000;
      auVar107._24_4_ = 0xff800000;
      auVar107._28_4_ = 0xff800000;
      auVar238 = vblendvps_avx(auVar107,auVar41,auVar102);
      auVar15 = auVar102 & auVar190;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0x7f,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0xbf,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar15[0x1f] < '\0') {
        auVar109 = vandps_avx(auVar190,auVar102);
        auVar190 = vcmpps_avx(auVar16,ZEXT832(0) << 0x20,2);
        auVar270._8_4_ = 0xff800000;
        auVar270._0_8_ = 0xff800000ff800000;
        auVar270._12_4_ = 0xff800000;
        auVar270._16_4_ = 0xff800000;
        auVar270._20_4_ = 0xff800000;
        auVar270._24_4_ = 0xff800000;
        auVar270._28_4_ = 0xff800000;
        auVar295._8_4_ = 0x7f800000;
        auVar295._0_8_ = 0x7f8000007f800000;
        auVar295._12_4_ = 0x7f800000;
        auVar295._16_4_ = 0x7f800000;
        auVar295._20_4_ = 0x7f800000;
        auVar295._24_4_ = 0x7f800000;
        auVar295._28_4_ = 0x7f800000;
        auVar16 = vblendvps_avx(auVar295,auVar270,auVar190);
        auVar99 = vpackssdw_avx(auVar109._0_16_,auVar109._16_16_);
        auVar15 = vpmovsxwd_avx2(auVar99);
        auVar263 = vblendvps_avx(auVar263,auVar16,auVar15);
        auVar16 = vblendvps_avx(auVar270,auVar295,auVar190);
        auVar238 = vblendvps_avx(auVar238,auVar16,auVar15);
        auVar113._0_8_ = auVar109._0_8_ ^ 0xffffffffffffffff;
        auVar113._8_4_ = auVar109._8_4_ ^ 0xffffffff;
        auVar113._12_4_ = auVar109._12_4_ ^ 0xffffffff;
        auVar113._16_4_ = auVar109._16_4_ ^ 0xffffffff;
        auVar113._20_4_ = auVar109._20_4_ ^ 0xffffffff;
        auVar113._24_4_ = auVar109._24_4_ ^ 0xffffffff;
        auVar113._28_4_ = auVar109._28_4_ ^ 0xffffffff;
        auVar109 = vorps_avx(auVar190,auVar113);
        auVar109 = vandps_avx(auVar102,auVar109);
      }
    }
    auVar266 = ZEXT3264(auVar263);
    auVar240 = ZEXT3264(auVar238);
    auVar249 = ZEXT3264(local_a40);
    auVar229 = ZEXT3264(auVar102);
    auVar102 = local_380 & auVar109;
    if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar102 >> 0x7f,0) != '\0') ||
          (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar102 >> 0xbf,0) != '\0') ||
        (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar102[0x1f] < '\0') {
      fVar148 = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_7c0._0_4_;
      auVar108._4_4_ = fVar148;
      auVar108._0_4_ = fVar148;
      auVar108._8_4_ = fVar148;
      auVar108._12_4_ = fVar148;
      auVar108._16_4_ = fVar148;
      auVar108._20_4_ = fVar148;
      auVar108._24_4_ = fVar148;
      auVar108._28_4_ = fVar148;
      auVar16 = vmaxps_avx(auVar108,auVar263);
      fVar148 = (ray->super_RayK<1>).tfar - (float)local_7c0._0_4_;
      auVar225._4_4_ = fVar148;
      auVar225._0_4_ = fVar148;
      auVar225._8_4_ = fVar148;
      auVar225._12_4_ = fVar148;
      auVar225._16_4_ = fVar148;
      auVar225._20_4_ = fVar148;
      auVar225._24_4_ = fVar148;
      auVar225._28_4_ = fVar148;
      auVar43._4_4_ = fVar211 * local_880._4_4_;
      auVar43._0_4_ = fVar195 * local_880._0_4_;
      auVar43._8_4_ = fVar212 * local_880._8_4_;
      auVar43._12_4_ = fVar213 * local_880._12_4_;
      auVar43._16_4_ = fVar214 * local_880._16_4_;
      auVar43._20_4_ = fVar215 * local_880._20_4_;
      auVar43._24_4_ = fVar216 * local_880._24_4_;
      auVar43._28_4_ = auVar145._28_4_;
      auVar99 = vfmadd213ps_fma(auVar164,local_940,auVar43);
      auVar198 = vfmadd213ps_fma(auVar232,local_820,ZEXT1632(auVar99));
      auVar44._4_4_ = local_880._4_4_ * fStack_63c;
      auVar44._0_4_ = local_880._0_4_ * local_640;
      auVar44._8_4_ = local_880._8_4_ * fStack_638;
      auVar44._12_4_ = local_880._12_4_ * fStack_634;
      auVar44._16_4_ = local_880._16_4_ * fStack_630;
      auVar44._20_4_ = local_880._20_4_ * fStack_62c;
      auVar44._24_4_ = local_880._24_4_ * fStack_628;
      auVar44._28_4_ = 0;
      auVar99 = vfmadd231ps_fma(auVar44,local_940,_local_620);
      auVar222 = vfmadd231ps_fma(ZEXT1632(auVar99),local_820,_local_600);
      auVar102 = vandps_avx(ZEXT1632(auVar222),local_7a0);
      auVar279._8_4_ = 0x219392ef;
      auVar279._0_8_ = 0x219392ef219392ef;
      auVar279._12_4_ = 0x219392ef;
      auVar279._16_4_ = 0x219392ef;
      auVar279._20_4_ = 0x219392ef;
      auVar279._24_4_ = 0x219392ef;
      auVar279._28_4_ = 0x219392ef;
      auVar145 = vcmpps_avx(auVar102,auVar279,1);
      auVar102 = vrcpps_avx(ZEXT1632(auVar222));
      auVar291._8_4_ = 0x3f800000;
      auVar291._0_8_ = &DAT_3f8000003f800000;
      auVar291._12_4_ = 0x3f800000;
      auVar291._16_4_ = 0x3f800000;
      auVar291._20_4_ = 0x3f800000;
      auVar291._24_4_ = 0x3f800000;
      auVar291._28_4_ = 0x3f800000;
      auVar232 = ZEXT1632(auVar222);
      auVar99 = vfnmadd213ps_fma(auVar102,auVar232,auVar291);
      auVar99 = vfmadd132ps_fma(ZEXT1632(auVar99),auVar102,auVar102);
      auVar189._0_8_ = auVar222._0_8_ ^ 0x8000000080000000;
      auVar189._8_4_ = auVar222._8_4_ ^ 0x80000000;
      auVar189._12_4_ = auVar222._12_4_ ^ 0x80000000;
      auVar189._16_4_ = 0x80000000;
      auVar189._20_4_ = 0x80000000;
      auVar189._24_4_ = 0x80000000;
      auVar189._28_4_ = 0x80000000;
      auVar265._0_4_ = auVar99._0_4_ * -auVar198._0_4_;
      auVar265._4_4_ = auVar99._4_4_ * -auVar198._4_4_;
      auVar265._8_4_ = auVar99._8_4_ * -auVar198._8_4_;
      auVar265._12_4_ = auVar99._12_4_ * -auVar198._12_4_;
      auVar265._16_4_ = 0x80000000;
      auVar265._20_4_ = 0x80000000;
      auVar265._24_4_ = 0x80000000;
      auVar265._28_4_ = 0;
      auVar102 = vcmpps_avx(auVar232,auVar189,1);
      auVar102 = vorps_avx(auVar145,auVar102);
      auVar292._8_4_ = 0xff800000;
      auVar292._0_8_ = 0xff800000ff800000;
      auVar292._12_4_ = 0xff800000;
      auVar292._16_4_ = 0xff800000;
      auVar292._20_4_ = 0xff800000;
      auVar292._24_4_ = 0xff800000;
      auVar292._28_4_ = 0xff800000;
      auVar102 = vblendvps_avx(auVar265,auVar292,auVar102);
      auVar164 = vminps_avx(auVar225,auVar238);
      auVar16 = vmaxps_avx(auVar16,auVar102);
      auVar102 = vcmpps_avx(auVar232,auVar189,6);
      auVar102 = vorps_avx(auVar145,auVar102);
      auVar293._8_4_ = 0x7f800000;
      auVar293._0_8_ = 0x7f8000007f800000;
      auVar293._12_4_ = 0x7f800000;
      auVar293._16_4_ = 0x7f800000;
      auVar293._20_4_ = 0x7f800000;
      auVar293._24_4_ = 0x7f800000;
      auVar293._28_4_ = 0x7f800000;
      auVar102 = vblendvps_avx(auVar265,auVar293,auVar102);
      auVar164 = vminps_avx(auVar164,auVar102);
      auVar102 = vsubps_avx(ZEXT832(0) << 0x20,_local_920);
      auVar145 = vsubps_avx(ZEXT832(0) << 0x20,_local_800);
      auVar45._4_4_ = auVar145._4_4_ * fVar281;
      auVar45._0_4_ = auVar145._0_4_ * fVar91;
      auVar45._8_4_ = auVar145._8_4_ * fVar284;
      auVar45._12_4_ = auVar145._12_4_ * fVar287;
      auVar45._16_4_ = auVar145._16_4_ * fVar12;
      auVar45._20_4_ = auVar145._20_4_ * fVar13;
      auVar45._24_4_ = auVar145._24_4_ * fVar14;
      auVar45._28_4_ = auVar145._28_4_;
      auVar249 = ZEXT3264(local_840);
      auVar99 = vfnmsub231ps_fma(auVar45,local_840,auVar102);
      auVar102 = vsubps_avx(ZEXT832(0) << 0x20,local_aa0);
      auVar198 = vfnmadd231ps_fma(ZEXT1632(auVar99),local_8a0,auVar102);
      auVar46._4_4_ = fVar281 * fStack_63c;
      auVar46._0_4_ = fVar91 * local_640;
      auVar46._8_4_ = fVar284 * fStack_638;
      auVar46._12_4_ = fVar287 * fStack_634;
      auVar46._16_4_ = fVar12 * fStack_630;
      auVar46._20_4_ = fVar13 * fStack_62c;
      auVar46._24_4_ = fVar14 * fStack_628;
      auVar46._28_4_ = auVar102._28_4_;
      auVar99 = vfnmsub231ps_fma(auVar46,local_840,_local_620);
      auVar222 = vfnmadd231ps_fma(ZEXT1632(auVar99),local_8a0,_local_600);
      auVar102 = vandps_avx(ZEXT1632(auVar222),local_7a0);
      auVar232 = vrcpps_avx(ZEXT1632(auVar222));
      auVar203._8_4_ = 0x219392ef;
      auVar203._0_8_ = 0x219392ef219392ef;
      auVar203._12_4_ = 0x219392ef;
      auVar203._16_4_ = 0x219392ef;
      auVar203._20_4_ = 0x219392ef;
      auVar203._24_4_ = 0x219392ef;
      auVar203._28_4_ = 0x219392ef;
      auVar145 = vcmpps_avx(auVar102,auVar203,1);
      auVar204._8_4_ = 0x3f800000;
      auVar204._0_8_ = &DAT_3f8000003f800000;
      auVar204._12_4_ = 0x3f800000;
      auVar204._16_4_ = 0x3f800000;
      auVar204._20_4_ = 0x3f800000;
      auVar204._24_4_ = 0x3f800000;
      auVar204._28_4_ = 0x3f800000;
      auVar190 = ZEXT1632(auVar222);
      auVar99 = vfnmadd213ps_fma(auVar232,auVar190,auVar204);
      auVar99 = vfmadd132ps_fma(ZEXT1632(auVar99),auVar232,auVar232);
      auVar239._0_8_ = auVar222._0_8_ ^ 0x8000000080000000;
      auVar239._8_4_ = auVar222._8_4_ ^ 0x80000000;
      auVar239._12_4_ = auVar222._12_4_ ^ 0x80000000;
      auVar239._16_4_ = 0x80000000;
      auVar239._20_4_ = 0x80000000;
      auVar239._24_4_ = 0x80000000;
      auVar239._28_4_ = 0x80000000;
      auVar240 = ZEXT3264(auVar239);
      auVar47._4_4_ = auVar99._4_4_ * -auVar198._4_4_;
      auVar47._0_4_ = auVar99._0_4_ * -auVar198._0_4_;
      auVar47._8_4_ = auVar99._8_4_ * -auVar198._8_4_;
      auVar47._12_4_ = auVar99._12_4_ * -auVar198._12_4_;
      auVar47._16_4_ = 0x80000000;
      auVar47._20_4_ = 0x80000000;
      auVar47._24_4_ = 0x80000000;
      auVar47._28_4_ = 0x80000000;
      auVar229 = ZEXT3264(auVar47);
      auVar102 = vcmpps_avx(auVar190,auVar239,1);
      auVar102 = vorps_avx(auVar102,auVar145);
      auVar205._8_4_ = 0xff800000;
      auVar205._0_8_ = 0xff800000ff800000;
      auVar205._12_4_ = 0xff800000;
      auVar205._16_4_ = 0xff800000;
      auVar205._20_4_ = 0xff800000;
      auVar205._24_4_ = 0xff800000;
      auVar205._28_4_ = 0xff800000;
      auVar102 = vblendvps_avx(auVar47,auVar205,auVar102);
      auVar266 = ZEXT3264(auVar102);
      local_9a0 = vmaxps_avx(auVar16,auVar102);
      auVar102 = vcmpps_avx(auVar190,auVar239,6);
      auVar102 = vorps_avx(auVar145,auVar102);
      auVar102 = vblendvps_avx(auVar47,auVar293,auVar102);
      auVar109 = vandps_avx(local_380,auVar109);
      local_500 = vminps_avx(auVar164,auVar102);
      auVar102 = vcmpps_avx(local_9a0,local_500,2);
      auVar145 = auVar109 & auVar102;
      if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar145 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar145 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar145 >> 0x7f,0) != '\0') ||
            (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar145 >> 0xbf,0) != '\0') ||
          (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar145[0x1f] < '\0') {
        auVar206._8_4_ = 0x3f800000;
        auVar206._0_8_ = &DAT_3f8000003f800000;
        auVar206._12_4_ = 0x3f800000;
        auVar206._16_4_ = 0x3f800000;
        auVar206._20_4_ = 0x3f800000;
        auVar206._24_4_ = 0x3f800000;
        auVar206._28_4_ = 0x3f800000;
        auVar145 = vminps_avx(local_540,auVar206);
        auVar164 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar145 = vmaxps_avx(auVar145,auVar164);
        auVar16 = vminps_avx(local_560,auVar206);
        auVar16 = vmaxps_avx(auVar16,auVar164);
        auVar48._4_4_ = (auVar145._4_4_ + 1.0) * 0.125;
        auVar48._0_4_ = (auVar145._0_4_ + 0.0) * 0.125;
        auVar48._8_4_ = (auVar145._8_4_ + 2.0) * 0.125;
        auVar48._12_4_ = (auVar145._12_4_ + 3.0) * 0.125;
        auVar48._16_4_ = (auVar145._16_4_ + 4.0) * 0.125;
        auVar48._20_4_ = (auVar145._20_4_ + 5.0) * 0.125;
        auVar48._24_4_ = (auVar145._24_4_ + 6.0) * 0.125;
        auVar48._28_4_ = auVar145._28_4_ + 7.0;
        auVar99 = vfmadd213ps_fma(auVar48,local_860,local_980);
        auVar49._4_4_ = (auVar16._4_4_ + 1.0) * 0.125;
        auVar49._0_4_ = (auVar16._0_4_ + 0.0) * 0.125;
        auVar49._8_4_ = (auVar16._8_4_ + 2.0) * 0.125;
        auVar49._12_4_ = (auVar16._12_4_ + 3.0) * 0.125;
        auVar49._16_4_ = (auVar16._16_4_ + 4.0) * 0.125;
        auVar49._20_4_ = (auVar16._20_4_ + 5.0) * 0.125;
        auVar49._24_4_ = (auVar16._24_4_ + 6.0) * 0.125;
        auVar49._28_4_ = auVar16._28_4_ + 7.0;
        auVar198 = vfmadd213ps_fma(auVar49,local_860,local_980);
        auVar145 = vminps_avx(local_8c0,local_8e0);
        auVar16 = vminps_avx(_local_900,local_6e0);
        auVar145 = vminps_avx(auVar145,auVar16);
        auVar145 = vsubps_avx(auVar145,local_740);
        auVar109 = vandps_avx(auVar102,auVar109);
        local_540 = ZEXT1632(auVar99);
        local_560 = ZEXT1632(auVar198);
        auVar50._4_4_ = auVar145._4_4_ * 0.99999976;
        auVar50._0_4_ = auVar145._0_4_ * 0.99999976;
        auVar50._8_4_ = auVar145._8_4_ * 0.99999976;
        auVar50._12_4_ = auVar145._12_4_ * 0.99999976;
        auVar50._16_4_ = auVar145._16_4_ * 0.99999976;
        auVar50._20_4_ = auVar145._20_4_ * 0.99999976;
        auVar50._24_4_ = auVar145._24_4_ * 0.99999976;
        auVar50._28_4_ = 0x3f7ffffc;
        auVar102 = vmaxps_avx(ZEXT832(0) << 0x20,auVar50);
        auVar51._4_4_ = auVar102._4_4_ * auVar102._4_4_;
        auVar51._0_4_ = auVar102._0_4_ * auVar102._0_4_;
        auVar51._8_4_ = auVar102._8_4_ * auVar102._8_4_;
        auVar51._12_4_ = auVar102._12_4_ * auVar102._12_4_;
        auVar51._16_4_ = auVar102._16_4_ * auVar102._16_4_;
        auVar51._20_4_ = auVar102._20_4_ * auVar102._20_4_;
        auVar51._24_4_ = auVar102._24_4_ * auVar102._24_4_;
        auVar51._28_4_ = auVar102._28_4_;
        auVar145 = vsubps_avx(local_700,auVar51);
        auVar52._4_4_ = auVar145._4_4_ * (float)local_780._4_4_;
        auVar52._0_4_ = auVar145._0_4_ * (float)local_780._0_4_;
        auVar52._8_4_ = auVar145._8_4_ * fStack_778;
        auVar52._12_4_ = auVar145._12_4_ * fStack_774;
        auVar52._16_4_ = auVar145._16_4_ * fStack_770;
        auVar52._20_4_ = auVar145._20_4_ * fStack_76c;
        auVar52._24_4_ = auVar145._24_4_ * fStack_768;
        auVar52._28_4_ = auVar102._28_4_;
        auVar16 = vsubps_avx(_local_720,auVar52);
        auVar62 = ZEXT412(0);
        auVar164 = ZEXT1232(auVar62) << 0x20;
        local_4a0 = ZEXT1232(auVar62) << 0x20;
        auVar102 = vcmpps_avx(auVar16,ZEXT1232(ZEXT812(0)) << 0x20,5);
        auVar249 = ZEXT3264(auVar102);
        if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar102 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar102 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar102 >> 0x7f,0) == '\0') &&
              (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar102 >> 0xbf,0) == '\0') &&
            (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar102[0x1f]) {
          local_680 = ZEXT1232(auVar62) << 0x20;
          _local_6a0 = ZEXT1232(auVar62) << 0x20;
          auVar256 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar202 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar226._8_4_ = 0x7f800000;
          auVar226._0_8_ = 0x7f8000007f800000;
          auVar226._12_4_ = 0x7f800000;
          auVar226._16_4_ = 0x7f800000;
          auVar226._20_4_ = 0x7f800000;
          auVar226._24_4_ = 0x7f800000;
          auVar226._28_4_ = 0x7f800000;
          auVar233._8_4_ = 0xff800000;
          auVar233._0_8_ = 0xff800000ff800000;
          auVar233._12_4_ = 0xff800000;
          auVar233._16_4_ = 0xff800000;
          auVar233._20_4_ = 0xff800000;
          auVar233._24_4_ = 0xff800000;
          auVar233._28_4_ = 0xff800000;
        }
        else {
          local_aa0 = auVar102;
          auVar163._0_4_ = fVar169 + fVar169;
          auVar163._4_4_ = fVar170 + fVar170;
          auVar163._8_4_ = fVar171 + fVar171;
          auVar163._12_4_ = fVar172 + fVar172;
          auVar163._16_4_ = fVar241 + fVar241;
          auVar163._20_4_ = fVar260 + fVar260;
          auVar163._24_4_ = fVar261 + fVar261;
          auVar163._28_4_ = fVar116 + fVar116;
          auVar164 = vrcpps_avx(auVar163);
          auVar207._8_4_ = 0x3f800000;
          auVar207._0_8_ = &DAT_3f8000003f800000;
          auVar207._12_4_ = 0x3f800000;
          auVar207._16_4_ = 0x3f800000;
          auVar207._20_4_ = 0x3f800000;
          auVar207._24_4_ = 0x3f800000;
          auVar207._28_4_ = 0x3f800000;
          auVar99 = vfnmadd213ps_fma(auVar163,auVar164,auVar207);
          auVar99 = vfmadd132ps_fma(ZEXT1632(auVar99),auVar164,auVar164);
          auVar164 = vsqrtps_avx(auVar16);
          auVar208._0_8_ = local_a40._0_8_ ^ 0x8000000080000000;
          auVar208._8_4_ = -local_a40._8_4_;
          auVar208._12_4_ = -local_a40._12_4_;
          auVar208._16_4_ = -local_a40._16_4_;
          auVar208._20_4_ = -local_a40._20_4_;
          auVar208._24_4_ = -local_a40._24_4_;
          auVar208._28_4_ = -local_a40._28_4_;
          auVar232 = vsubps_avx(auVar208,auVar164);
          auVar164 = vsubps_avx(auVar164,local_a40);
          auVar294._0_4_ = auVar232._0_4_ * auVar99._0_4_;
          auVar294._4_4_ = auVar232._4_4_ * auVar99._4_4_;
          auVar294._8_4_ = auVar232._8_4_ * auVar99._8_4_;
          auVar294._12_4_ = auVar232._12_4_ * auVar99._12_4_;
          auVar294._16_4_ = auVar232._16_4_ * 0.0;
          auVar294._20_4_ = auVar232._20_4_ * 0.0;
          auVar294._24_4_ = auVar232._24_4_ * 0.0;
          auVar294._28_4_ = 0;
          fVar116 = auVar164._0_4_ * auVar99._0_4_;
          fVar91 = auVar164._4_4_ * auVar99._4_4_;
          auVar53._4_4_ = fVar91;
          auVar53._0_4_ = fVar116;
          fVar281 = auVar164._8_4_ * auVar99._8_4_;
          auVar53._8_4_ = fVar281;
          fVar148 = auVar164._12_4_ * auVar99._12_4_;
          auVar53._12_4_ = fVar148;
          fVar284 = auVar164._16_4_ * 0.0;
          auVar53._16_4_ = fVar284;
          fVar150 = auVar164._20_4_ * 0.0;
          auVar53._20_4_ = fVar150;
          fVar287 = auVar164._24_4_ * 0.0;
          auVar53._24_4_ = fVar287;
          auVar53._28_4_ = 0x80000000;
          auVar99 = vfmadd213ps_fma(auVar256,auVar294,auVar275);
          auVar198 = vfmadd213ps_fma(auVar256,auVar53,auVar275);
          auVar54._28_4_ = auVar232._28_4_;
          auVar54._0_28_ =
               ZEXT1628(CONCAT412(fVar151 * auVar99._12_4_,
                                  CONCAT48(fVar149 * auVar99._8_4_,
                                           CONCAT44(fVar152 * auVar99._4_4_,fVar147 * auVar99._0_4_)
                                          )));
          auVar164 = ZEXT1632(CONCAT412(fVar151 * auVar198._12_4_,
                                        CONCAT48(fVar149 * auVar198._8_4_,
                                                 CONCAT44(fVar152 * auVar198._4_4_,
                                                          fVar147 * auVar198._0_4_))));
          auVar99 = vfmadd213ps_fma(local_680,auVar54,local_ac0);
          auVar198 = vfmadd213ps_fma(local_680,auVar164,local_ac0);
          auVar222 = vfmadd213ps_fma(_local_6a0,auVar54,local_ae0);
          auVar124 = vfmadd213ps_fma(_local_6a0,auVar164,local_ae0);
          auVar4 = vfmadd213ps_fma(auVar54,_local_580,local_660);
          auVar272 = vfmadd213ps_fma(_local_580,auVar164,local_660);
          auVar55._4_4_ = auVar294._4_4_ * (float)local_600._4_4_;
          auVar55._0_4_ = auVar294._0_4_ * (float)local_600._0_4_;
          auVar55._8_4_ = auVar294._8_4_ * fStack_5f8;
          auVar55._12_4_ = auVar294._12_4_ * fStack_5f4;
          auVar55._16_4_ = auVar294._16_4_ * fStack_5f0;
          auVar55._20_4_ = auVar294._20_4_ * fStack_5ec;
          auVar55._24_4_ = auVar294._24_4_ * fStack_5e8;
          auVar55._28_4_ = 0;
          auVar164 = vsubps_avx(auVar55,ZEXT1632(auVar99));
          auVar191._0_4_ = (float)local_620._0_4_ * auVar294._0_4_;
          auVar191._4_4_ = (float)local_620._4_4_ * auVar294._4_4_;
          auVar191._8_4_ = fStack_618 * auVar294._8_4_;
          auVar191._12_4_ = fStack_614 * auVar294._12_4_;
          auVar191._16_4_ = fStack_610 * auVar294._16_4_;
          auVar191._20_4_ = fStack_60c * auVar294._20_4_;
          auVar191._24_4_ = fStack_608 * auVar294._24_4_;
          auVar191._28_4_ = 0;
          auVar256 = vsubps_avx(auVar191,ZEXT1632(auVar222));
          auVar227._0_4_ = local_640 * auVar294._0_4_;
          auVar227._4_4_ = fStack_63c * auVar294._4_4_;
          auVar227._8_4_ = fStack_638 * auVar294._8_4_;
          auVar227._12_4_ = fStack_634 * auVar294._12_4_;
          auVar227._16_4_ = fStack_630 * auVar294._16_4_;
          auVar227._20_4_ = fStack_62c * auVar294._20_4_;
          auVar227._24_4_ = fStack_628 * auVar294._24_4_;
          auVar227._28_4_ = 0;
          auVar232 = vsubps_avx(auVar227,ZEXT1632(auVar4));
          auVar202 = auVar232._0_28_;
          auVar56._4_4_ = fVar91 * (float)local_600._4_4_;
          auVar56._0_4_ = fVar116 * (float)local_600._0_4_;
          auVar56._8_4_ = fVar281 * fStack_5f8;
          auVar56._12_4_ = fVar148 * fStack_5f4;
          auVar56._16_4_ = fVar284 * fStack_5f0;
          auVar56._20_4_ = fVar150 * fStack_5ec;
          auVar56._24_4_ = fVar287 * fStack_5e8;
          auVar56._28_4_ = 0;
          local_4a0 = vsubps_avx(auVar56,ZEXT1632(auVar198));
          auVar57._4_4_ = (float)local_620._4_4_ * fVar91;
          auVar57._0_4_ = (float)local_620._0_4_ * fVar116;
          auVar57._8_4_ = fStack_618 * fVar281;
          auVar57._12_4_ = fStack_614 * fVar148;
          auVar57._16_4_ = fStack_610 * fVar284;
          auVar57._20_4_ = fStack_60c * fVar150;
          auVar57._24_4_ = fStack_608 * fVar287;
          auVar57._28_4_ = local_4a0._28_4_;
          local_680 = vsubps_avx(auVar57,ZEXT1632(auVar124));
          auVar58._4_4_ = fStack_63c * fVar91;
          auVar58._0_4_ = local_640 * fVar116;
          auVar58._8_4_ = fStack_638 * fVar281;
          auVar58._12_4_ = fStack_634 * fVar148;
          auVar58._16_4_ = fStack_630 * fVar284;
          auVar58._20_4_ = fStack_62c * fVar150;
          auVar58._24_4_ = fStack_628 * fVar287;
          auVar58._28_4_ = local_680._28_4_;
          _local_6a0 = vsubps_avx(auVar58,ZEXT1632(auVar272));
          auVar232 = vcmpps_avx(auVar16,_DAT_02020f00,5);
          auVar228._8_4_ = 0x7f800000;
          auVar228._0_8_ = 0x7f8000007f800000;
          auVar228._12_4_ = 0x7f800000;
          auVar228._16_4_ = 0x7f800000;
          auVar228._20_4_ = 0x7f800000;
          auVar228._24_4_ = 0x7f800000;
          auVar228._28_4_ = 0x7f800000;
          auVar226 = vblendvps_avx(auVar228,auVar294,auVar232);
          auVar16 = vandps_avx(local_7a0,local_5a0);
          auVar16 = vmaxps_avx(local_480,auVar16);
          auVar59._4_4_ = auVar16._4_4_ * 1.9073486e-06;
          auVar59._0_4_ = auVar16._0_4_ * 1.9073486e-06;
          auVar59._8_4_ = auVar16._8_4_ * 1.9073486e-06;
          auVar59._12_4_ = auVar16._12_4_ * 1.9073486e-06;
          auVar59._16_4_ = auVar16._16_4_ * 1.9073486e-06;
          auVar59._20_4_ = auVar16._20_4_ * 1.9073486e-06;
          auVar59._24_4_ = auVar16._24_4_ * 1.9073486e-06;
          auVar59._28_4_ = auVar16._28_4_;
          auVar16 = vandps_avx(local_7a0,local_6c0);
          auVar16 = vcmpps_avx(auVar16,auVar59,1);
          auVar234._8_4_ = 0xff800000;
          auVar234._0_8_ = 0xff800000ff800000;
          auVar234._12_4_ = 0xff800000;
          auVar234._16_4_ = 0xff800000;
          auVar234._20_4_ = 0xff800000;
          auVar234._24_4_ = 0xff800000;
          auVar234._28_4_ = 0xff800000;
          auVar233 = vblendvps_avx(auVar234,auVar53,auVar232);
          auVar275 = auVar232 & auVar16;
          if ((((((((auVar275 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar275 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar275 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar275 >> 0x7f,0) == '\0') &&
                (auVar275 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar275 >> 0xbf,0) == '\0') &&
              (auVar275 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar275[0x1f]) {
            auVar249 = ZEXT3264(auVar102);
          }
          else {
            auVar102 = vandps_avx(auVar16,auVar232);
            auVar16 = vcmpps_avx(auVar145,ZEXT832(0) << 0x20,2);
            auVar271._8_4_ = 0xff800000;
            auVar271._0_8_ = 0xff800000ff800000;
            auVar271._12_4_ = 0xff800000;
            auVar271._16_4_ = 0xff800000;
            auVar271._20_4_ = 0xff800000;
            auVar271._24_4_ = 0xff800000;
            auVar271._28_4_ = 0xff800000;
            auVar276._8_4_ = 0x7f800000;
            auVar276._0_8_ = 0x7f8000007f800000;
            auVar276._12_4_ = 0x7f800000;
            auVar276._16_4_ = 0x7f800000;
            auVar276._20_4_ = 0x7f800000;
            auVar276._24_4_ = 0x7f800000;
            auVar276._28_4_ = 0x7f800000;
            auVar145 = vblendvps_avx(auVar276,auVar271,auVar16);
            auVar99 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
            auVar275 = vpmovsxwd_avx2(auVar99);
            auVar226 = vblendvps_avx(auVar226,auVar145,auVar275);
            auVar145 = vblendvps_avx(auVar271,auVar276,auVar16);
            auVar233 = vblendvps_avx(auVar233,auVar145,auVar275);
            auVar248._0_8_ = auVar102._0_8_ ^ 0xffffffffffffffff;
            auVar248._8_4_ = auVar102._8_4_ ^ 0xffffffff;
            auVar248._12_4_ = auVar102._12_4_ ^ 0xffffffff;
            auVar248._16_4_ = auVar102._16_4_ ^ 0xffffffff;
            auVar248._20_4_ = auVar102._20_4_ ^ 0xffffffff;
            auVar248._24_4_ = auVar102._24_4_ ^ 0xffffffff;
            auVar248._28_4_ = auVar102._28_4_ ^ 0xffffffff;
            auVar102 = vorps_avx(auVar16,auVar248);
            auVar102 = vandps_avx(auVar102,auVar232);
            auVar249 = ZEXT3264(auVar102);
          }
        }
        uVar87 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
        auVar253._4_4_ = uVar87;
        auVar253._0_4_ = uVar87;
        auVar253._8_4_ = uVar87;
        auVar253._12_4_ = uVar87;
        auVar253._16_4_ = uVar87;
        auVar253._20_4_ = uVar87;
        auVar253._24_4_ = uVar87;
        auVar253._28_4_ = uVar87;
        auVar254 = ZEXT3264(auVar253);
        uVar87 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
        auVar257._4_4_ = uVar87;
        auVar257._0_4_ = uVar87;
        auVar257._8_4_ = uVar87;
        auVar257._12_4_ = uVar87;
        auVar257._16_4_ = uVar87;
        auVar257._20_4_ = uVar87;
        auVar257._24_4_ = uVar87;
        auVar257._28_4_ = uVar87;
        auVar258 = ZEXT3264(auVar257);
        fVar116 = (ray->super_RayK<1>).dir.field_0.m128[2];
        local_4e0 = local_9a0;
        local_4c0 = vminps_avx(local_500,auVar226);
        _local_520 = vmaxps_avx(local_9a0,auVar233);
        auVar266 = ZEXT3264(_local_520);
        auVar102 = vcmpps_avx(local_9a0,local_4c0,2);
        local_5a0 = vandps_avx(auVar102,auVar109);
        auVar229 = ZEXT3264(local_5a0);
        local_5c0 = local_5a0;
        auVar102 = vcmpps_avx(_local_520,local_500,2);
        local_5e0 = vandps_avx(auVar102,auVar109);
        auVar240 = ZEXT3264(local_5e0);
        auVar109 = vorps_avx(local_5e0,local_5a0);
        if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar109 >> 0x7f,0) != '\0') ||
              (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar109 >> 0xbf,0) != '\0') ||
            (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar109[0x1f] < '\0') {
          auVar210 = ZEXT3264(local_9a0);
          local_3e0 = local_5e0;
          _local_3c0 = _local_520;
          local_400._0_8_ = auVar249._0_8_ ^ 0xffffffffffffffff;
          local_400._8_4_ = auVar249._8_4_ ^ 0xffffffff;
          local_400._12_4_ = auVar249._12_4_ ^ 0xffffffff;
          local_400._16_4_ = auVar249._16_4_ ^ 0xffffffff;
          local_400._20_4_ = auVar249._20_4_ ^ 0xffffffff;
          local_400._24_4_ = auVar249._24_4_ ^ 0xffffffff;
          local_400._28_4_ = auVar249._28_4_ ^ 0xffffffff;
          auVar229 = ZEXT3264(local_400);
          auVar60._4_4_ = fVar116 * auVar202._4_4_;
          auVar60._0_4_ = fVar116 * auVar202._0_4_;
          auVar60._8_4_ = fVar116 * auVar202._8_4_;
          auVar60._12_4_ = fVar116 * auVar202._12_4_;
          auVar60._16_4_ = fVar116 * auVar202._16_4_;
          auVar60._20_4_ = fVar116 * auVar202._20_4_;
          auVar60._24_4_ = fVar116 * auVar202._24_4_;
          auVar60._28_4_ = auVar109._28_4_;
          auVar266 = ZEXT3264(auVar257);
          auVar99 = vfmadd213ps_fma(auVar256,auVar257,auVar60);
          auVar258 = ZEXT3264(auVar253);
          auVar99 = vfmadd213ps_fma(auVar164,auVar253,ZEXT1632(auVar99));
          auVar109 = vandps_avx(ZEXT1632(auVar99),local_7a0);
          auVar136._8_4_ = 0x3e99999a;
          auVar136._0_8_ = 0x3e99999a3e99999a;
          auVar136._12_4_ = 0x3e99999a;
          auVar136._16_4_ = 0x3e99999a;
          auVar136._20_4_ = 0x3e99999a;
          auVar136._24_4_ = 0x3e99999a;
          auVar136._28_4_ = 0x3e99999a;
          auVar109 = vcmpps_avx(auVar109,auVar136,1);
          auVar109 = vorps_avx(auVar109,local_400);
          auVar137._8_4_ = 3;
          auVar137._0_8_ = 0x300000003;
          auVar137._12_4_ = 3;
          auVar137._16_4_ = 3;
          auVar137._20_4_ = 3;
          auVar137._24_4_ = 3;
          auVar137._28_4_ = 3;
          auVar165._8_4_ = 2;
          auVar165._0_8_ = 0x200000002;
          auVar165._12_4_ = 2;
          auVar165._16_4_ = 2;
          auVar165._20_4_ = 2;
          auVar165._24_4_ = 2;
          auVar165._28_4_ = 2;
          auVar109 = vblendvps_avx(auVar165,auVar137,auVar109);
          uVar87 = (undefined4)uVar88;
          local_420._4_4_ = uVar87;
          local_420._0_4_ = uVar87;
          local_420._8_4_ = uVar87;
          local_420._12_4_ = uVar87;
          local_420._16_4_ = uVar87;
          local_420._20_4_ = uVar87;
          local_420._24_4_ = uVar87;
          local_420._28_4_ = uVar87;
          local_6c0 = vpcmpgtd_avx2(auVar109,local_420);
          local_5c0 = vpandn_avx2(local_6c0,local_5a0);
          auVar194 = ZEXT3264(local_5c0);
          auVar109 = local_5a0 & ~local_6c0;
          local_660 = ZEXT1632(CONCAT88(auVar92._8_8_,uVar88));
          fVar91 = fVar116;
          fVar147 = fVar116;
          fVar281 = fVar116;
          fVar152 = fVar116;
          fVar148 = fVar116;
          fVar284 = fVar116;
          if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar109 >> 0x7f,0) != '\0') ||
                (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar109 >> 0xbf,0) != '\0') ||
              (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar109[0x1f] < '\0') {
            auVar198 = vminps_avx(local_9e0,local_a00);
            auVar99 = vmaxps_avx(local_9e0,local_a00);
            auVar222 = vminps_avx(local_9f0,_local_a10);
            auVar124 = vminps_avx(auVar198,auVar222);
            auVar198 = vmaxps_avx(local_9f0,_local_a10);
            auVar222 = vmaxps_avx(auVar99,auVar198);
            local_6e0._8_4_ = 0x7fffffff;
            local_6e0._0_8_ = 0x7fffffff7fffffff;
            local_6e0._12_4_ = 0x7fffffff;
            auVar99 = vandps_avx(auVar124,local_6e0._0_16_);
            auVar198 = vandps_avx(auVar222,local_6e0._0_16_);
            auVar99 = vmaxps_avx(auVar99,auVar198);
            auVar198 = vmovshdup_avx(auVar99);
            auVar198 = vmaxss_avx(auVar198,auVar99);
            auVar99 = vshufpd_avx(auVar99,auVar99,1);
            auVar99 = vmaxss_avx(auVar99,auVar198);
            local_940._4_24_ = auVar251._4_24_;
            local_940._0_4_ = auVar99._0_4_ * 1.9073486e-06;
            local_940._28_4_ = 0;
            auVar99 = vshufps_avx(auVar222,auVar222,0xff);
            _local_780 = auVar99;
            local_580._4_4_ = local_9a0._4_4_ + (float)local_760._4_4_;
            local_580._0_4_ = local_9a0._0_4_ + (float)local_760._0_4_;
            fStack_578 = local_9a0._8_4_ + fStack_758;
            fStack_574 = local_9a0._12_4_ + fStack_754;
            fStack_570 = local_9a0._16_4_ + fStack_750;
            fStack_56c = local_9a0._20_4_ + fStack_74c;
            fStack_568 = local_9a0._24_4_ + fStack_748;
            fStack_564 = local_9a0._28_4_ + fStack_744;
            local_8c0 = auVar253;
            local_8e0 = auVar257;
            local_900._4_4_ = fVar116;
            local_900._0_4_ = fVar116;
            fStack_8f8 = fVar116;
            fStack_8f4 = fVar116;
            fStack_8f0 = fVar116;
            fStack_8ec = fVar116;
            fStack_8e8 = fVar116;
            fStack_8e4 = fVar116;
            local_840 = auVar17;
            do {
              auVar138._8_4_ = 0x7f800000;
              auVar138._0_8_ = 0x7f8000007f800000;
              auVar138._12_4_ = 0x7f800000;
              auVar138._16_4_ = 0x7f800000;
              auVar138._20_4_ = 0x7f800000;
              auVar138._24_4_ = 0x7f800000;
              auVar138._28_4_ = 0x7f800000;
              auVar109 = auVar194._0_32_;
              auVar102 = vblendvps_avx(auVar138,auVar210._0_32_,auVar109);
              auVar145 = vshufps_avx(auVar102,auVar102,0xb1);
              auVar145 = vminps_avx(auVar102,auVar145);
              auVar16 = vshufpd_avx(auVar145,auVar145,5);
              auVar145 = vminps_avx(auVar145,auVar16);
              auVar16 = vpermpd_avx2(auVar145,0x4e);
              auVar145 = vminps_avx(auVar145,auVar16);
              auVar102 = vcmpps_avx(auVar102,auVar145,0);
              auVar145 = auVar109 & auVar102;
              if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar145 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar145 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar145 >> 0x7f,0) != '\0') ||
                    (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar145 >> 0xbf,0) != '\0') ||
                  (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar145[0x1f] < '\0') {
                auVar109 = vandps_avx(auVar102,auVar109);
              }
              uVar83 = vmovmskps_avx(auVar109);
              iVar18 = 0;
              for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
                iVar18 = iVar18 + 1;
              }
              uVar83 = iVar18 << 2;
              *(undefined4 *)(local_5c0 + uVar83) = 0;
              aVar2 = (ray->super_RayK<1>).dir.field_0;
              local_820._0_16_ = (undefined1  [16])aVar2;
              auVar99 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
              auVar249 = ZEXT464(*(uint *)(local_540 + uVar83));
              if (auVar99._0_4_ < 0.0) {
                local_ae0._0_16_ = ZEXT416(*(uint *)(local_540 + uVar83));
                local_ac0._0_16_ = ZEXT416((uint)*(float *)(local_4e0 + uVar83));
                fVar116 = sqrtf(auVar99._0_4_);
                auVar249 = ZEXT1664(local_ae0._0_16_);
                fVar149 = (float)local_ac0._0_4_;
                uVar87 = local_ac0._4_4_;
                uVar277 = local_ac0._8_4_;
                uVar278 = local_ac0._12_4_;
              }
              else {
                auVar99 = vsqrtss_avx(auVar99,auVar99);
                fVar116 = auVar99._0_4_;
                fVar149 = *(float *)(local_4e0 + uVar83);
                uVar87 = 0;
                uVar277 = 0;
                uVar278 = 0;
              }
              local_860._0_4_ = fVar116 * 1.9073486e-06;
              lVar89 = 4;
              do {
                auVar109 = local_ac0;
                fVar91 = auVar249._0_4_;
                fVar116 = 1.0 - fVar91;
                auVar118._0_4_ = local_a00._0_4_ * fVar91;
                auVar118._4_4_ = local_a00._4_4_ * fVar91;
                auVar118._8_4_ = local_a00._8_4_ * fVar91;
                auVar118._12_4_ = local_a00._12_4_ * fVar91;
                auVar156._4_4_ = fVar116;
                auVar156._0_4_ = fVar116;
                auVar156._8_4_ = fVar116;
                auVar156._12_4_ = fVar116;
                auVar99 = vfmadd231ps_fma(auVar118,auVar156,local_9e0);
                auVar175._0_4_ = local_9f0._0_4_ * fVar91;
                auVar175._4_4_ = local_9f0._4_4_ * fVar91;
                auVar175._8_4_ = local_9f0._8_4_ * fVar91;
                auVar175._12_4_ = local_9f0._12_4_ * fVar91;
                auVar198 = vfmadd231ps_fma(auVar175,auVar156,local_a00);
                auVar219._0_4_ = fVar91 * auVar198._0_4_;
                auVar219._4_4_ = fVar91 * auVar198._4_4_;
                auVar219._8_4_ = fVar91 * auVar198._8_4_;
                auVar219._12_4_ = fVar91 * auVar198._12_4_;
                local_880._0_16_ = vfmadd231ps_fma(auVar219,auVar156,auVar99);
                auVar119._0_4_ = fVar91 * (float)local_a10._0_4_;
                auVar119._4_4_ = fVar91 * (float)local_a10._4_4_;
                auVar119._8_4_ = fVar91 * fStack_a08;
                auVar119._12_4_ = fVar91 * fStack_a04;
                auVar99 = vfmadd231ps_fma(auVar119,auVar156,local_9f0);
                auVar197._0_4_ = fVar91 * auVar99._0_4_;
                auVar197._4_4_ = fVar91 * auVar99._4_4_;
                auVar197._8_4_ = fVar91 * auVar99._8_4_;
                auVar197._12_4_ = fVar91 * auVar99._12_4_;
                auVar198 = vfmadd231ps_fma(auVar197,auVar156,auVar198);
                auVar120._4_4_ = fVar149;
                auVar120._0_4_ = fVar149;
                auVar120._8_4_ = fVar149;
                auVar120._12_4_ = fVar149;
                auVar99 = vfmadd213ps_fma(auVar120,local_820._0_16_,_DAT_01feba10);
                auVar95._0_4_ = fVar91 * auVar198._0_4_;
                auVar95._4_4_ = fVar91 * auVar198._4_4_;
                auVar95._8_4_ = fVar91 * auVar198._8_4_;
                auVar95._12_4_ = fVar91 * auVar198._12_4_;
                auVar222 = vfmadd231ps_fma(auVar95,local_880._0_16_,auVar156);
                local_8a0._0_16_ = auVar222;
                auVar99 = vsubps_avx(auVar99,auVar222);
                _local_800 = auVar99;
                auVar99 = vdpps_avx(auVar99,auVar99,0x7f);
                local_ae0._0_16_ = auVar249._0_16_;
                local_ac0._4_4_ = uVar87;
                local_ac0._0_4_ = fVar149;
                local_ac0._8_4_ = uVar277;
                local_ac0._16_16_ = auVar109._16_16_;
                local_ac0._12_4_ = uVar278;
                local_aa0._0_16_ = auVar99;
                if (auVar99._0_4_ < 0.0) {
                  _local_920 = ZEXT416((uint)fVar116);
                  local_960._0_16_ = auVar198;
                  auVar194._0_4_ = sqrtf(auVar99._0_4_);
                  auVar194._4_60_ = extraout_var;
                  auVar99 = auVar194._0_16_;
                  auVar198 = local_960._0_16_;
                  auVar222 = local_ae0._0_16_;
                  auVar124 = _local_920;
                  fVar149 = (float)local_ac0._0_4_;
                }
                else {
                  auVar99 = vsqrtss_avx(auVar99,auVar99);
                  auVar222 = auVar249._0_16_;
                  auVar124 = ZEXT416((uint)fVar116);
                }
                auVar198 = vsubps_avx(auVar198,local_880._0_16_);
                local_880._0_4_ = auVar198._0_4_ * 3.0;
                local_880._4_4_ = auVar198._4_4_ * 3.0;
                local_880._8_4_ = auVar198._8_4_ * 3.0;
                local_880._12_4_ = auVar198._12_4_ * 3.0;
                auVar198 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar124,auVar222);
                auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar222,auVar124);
                fVar116 = auVar124._0_4_ * 6.0;
                fVar91 = auVar198._0_4_ * 6.0;
                fVar147 = auVar4._0_4_ * 6.0;
                fVar281 = auVar222._0_4_ * 6.0;
                auVar176._0_4_ = fVar281 * (float)local_a10._0_4_;
                auVar176._4_4_ = fVar281 * (float)local_a10._4_4_;
                auVar176._8_4_ = fVar281 * fStack_a08;
                auVar176._12_4_ = fVar281 * fStack_a04;
                auVar121._4_4_ = fVar147;
                auVar121._0_4_ = fVar147;
                auVar121._8_4_ = fVar147;
                auVar121._12_4_ = fVar147;
                auVar198 = vfmadd132ps_fma(auVar121,auVar176,local_9f0);
                auVar177._4_4_ = fVar91;
                auVar177._0_4_ = fVar91;
                auVar177._8_4_ = fVar91;
                auVar177._12_4_ = fVar91;
                auVar198 = vfmadd132ps_fma(auVar177,auVar198,local_a00);
                auVar222 = vdpps_avx(local_880._0_16_,local_880._0_16_,0x7f);
                auVar122._4_4_ = fVar116;
                auVar122._0_4_ = fVar116;
                auVar122._8_4_ = fVar116;
                auVar122._12_4_ = fVar116;
                auVar4 = vfmadd132ps_fma(auVar122,auVar198,local_9e0);
                auVar198 = vblendps_avx(auVar222,_DAT_01feba10,0xe);
                auVar124 = vrsqrtss_avx(auVar198,auVar198);
                fVar147 = auVar222._0_4_;
                fVar116 = auVar124._0_4_;
                auVar124 = vdpps_avx(local_880._0_16_,auVar4,0x7f);
                fVar116 = fVar116 * 1.5 + fVar147 * -0.5 * fVar116 * fVar116 * fVar116;
                auVar123._0_4_ = auVar4._0_4_ * fVar147;
                auVar123._4_4_ = auVar4._4_4_ * fVar147;
                auVar123._8_4_ = auVar4._8_4_ * fVar147;
                auVar123._12_4_ = auVar4._12_4_ * fVar147;
                fVar91 = auVar124._0_4_;
                auVar220._0_4_ = local_880._0_4_ * fVar91;
                auVar220._4_4_ = local_880._4_4_ * fVar91;
                auVar220._8_4_ = local_880._8_4_ * fVar91;
                auVar220._12_4_ = local_880._12_4_ * fVar91;
                auVar124 = vsubps_avx(auVar123,auVar220);
                auVar198 = vrcpss_avx(auVar198,auVar198);
                auVar4 = vfnmadd213ss_fma(auVar198,auVar222,ZEXT416(0x40000000));
                fVar91 = auVar198._0_4_ * auVar4._0_4_;
                auVar198 = vmaxss_avx(ZEXT416((uint)local_940._0_4_),
                                      ZEXT416((uint)(fVar149 * (float)local_860._0_4_)));
                local_920._0_4_ = auVar198._0_4_;
                uVar88 = CONCAT44(local_880._4_4_,local_880._0_4_);
                auVar242._0_8_ = uVar88 ^ 0x8000000080000000;
                auVar242._8_4_ = -local_880._8_4_;
                auVar242._12_4_ = -local_880._12_4_;
                local_980._0_4_ = fVar116 * auVar124._0_4_ * fVar91;
                local_980._4_4_ = fVar116 * auVar124._4_4_ * fVar91;
                local_980._8_4_ = fVar116 * auVar124._8_4_ * fVar91;
                local_980._12_4_ = fVar116 * auVar124._12_4_ * fVar91;
                local_a40._0_4_ = local_880._0_4_ * fVar116;
                local_a40._4_4_ = local_880._4_4_ * fVar116;
                local_a40._8_4_ = local_880._8_4_ * fVar116;
                local_a40._12_4_ = local_880._12_4_ * fVar116;
                if (fVar147 < -fVar147) {
                  local_960._0_4_ = auVar99._0_4_;
                  local_840._0_16_ = auVar242;
                  fVar116 = sqrtf(fVar147);
                  auVar99 = ZEXT416((uint)local_960._0_4_);
                  auVar242 = local_840._0_16_;
                }
                else {
                  auVar198 = vsqrtss_avx(auVar222,auVar222);
                  fVar116 = auVar198._0_4_;
                }
                local_960._0_16_ = vdpps_avx(_local_800,local_a40._0_16_,0x7f);
                auVar4 = vfmadd213ss_fma(ZEXT416((uint)local_940._0_4_),auVar99,
                                         ZEXT416((uint)local_920._0_4_));
                auVar198 = vdpps_avx(auVar242,local_a40._0_16_,0x7f);
                auVar222 = vdpps_avx(_local_800,local_980._0_16_,0x7f);
                auVar124 = vdpps_avx(local_820._0_16_,local_a40._0_16_,0x7f);
                auVar99 = vfmadd213ss_fma(ZEXT416((uint)(auVar99._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_940._0_4_ / fVar116)),auVar4);
                local_840._0_4_ = auVar99._0_4_;
                auVar96._0_4_ = local_960._0_4_ * local_960._0_4_;
                auVar96._4_4_ = local_960._4_4_ * local_960._4_4_;
                auVar96._8_4_ = local_960._8_4_ * local_960._8_4_;
                auVar96._12_4_ = local_960._12_4_ * local_960._12_4_;
                auVar99 = vdpps_avx(_local_800,auVar242,0x7f);
                auVar272 = vsubps_avx(local_aa0._0_16_,auVar96);
                auVar4 = vrsqrtss_avx(auVar272,auVar272);
                fVar91 = auVar272._0_4_;
                fVar116 = auVar4._0_4_;
                fVar116 = fVar116 * 1.5 + fVar91 * -0.5 * fVar116 * fVar116 * fVar116;
                auVar4 = vdpps_avx(_local_800,local_820._0_16_,0x7f);
                local_a40._0_16_ = ZEXT416((uint)(auVar198._0_4_ + auVar222._0_4_));
                local_980._0_16_ = vfnmadd231ss_fma(auVar99,local_960._0_16_,local_a40._0_16_);
                auVar99 = vfnmadd231ss_fma(auVar4,local_960._0_16_,auVar124);
                if (fVar91 < 0.0) {
                  local_700._0_16_ = auVar124;
                  local_720._0_4_ = fVar116;
                  local_740._0_16_ = auVar99;
                  fVar91 = sqrtf(fVar91);
                  fVar116 = (float)local_720._0_4_;
                  auVar99 = local_740._0_16_;
                  auVar124 = local_700._0_16_;
                }
                else {
                  auVar198 = vsqrtss_avx(auVar272,auVar272);
                  fVar91 = auVar198._0_4_;
                }
                auVar210 = ZEXT3264(local_9a0);
                auVar258 = ZEXT3264(local_8c0);
                auVar266 = ZEXT3264(local_8e0);
                auVar198 = vpermilps_avx(local_8a0._0_16_,0xff);
                auVar4 = vshufps_avx(local_880._0_16_,local_880._0_16_,0xff);
                auVar222 = vfmsub213ss_fma(local_980._0_16_,ZEXT416((uint)fVar116),auVar4);
                auVar178._0_8_ = auVar124._0_8_ ^ 0x8000000080000000;
                auVar178._8_4_ = auVar124._8_4_ ^ 0x80000000;
                auVar178._12_4_ = auVar124._12_4_ ^ 0x80000000;
                auVar199._0_8_ = auVar222._0_8_ ^ 0x8000000080000000;
                auVar199._8_4_ = auVar222._8_4_ ^ 0x80000000;
                auVar199._12_4_ = auVar222._12_4_ ^ 0x80000000;
                auVar240 = ZEXT1664(local_a40._0_16_);
                auVar99 = ZEXT416((uint)(auVar99._0_4_ * fVar116));
                auVar222 = vfmsub231ss_fma(ZEXT416((uint)(auVar124._0_4_ * auVar222._0_4_)),
                                           local_a40._0_16_,auVar99);
                auVar99 = vinsertps_avx(auVar99,auVar178,0x10);
                uVar87 = auVar222._0_4_;
                auVar179._4_4_ = uVar87;
                auVar179._0_4_ = uVar87;
                auVar179._8_4_ = uVar87;
                auVar179._12_4_ = uVar87;
                auVar99 = vdivps_avx(auVar99,auVar179);
                auVar254 = ZEXT1664(local_960._0_16_);
                auVar124 = ZEXT416((uint)(fVar91 - auVar198._0_4_));
                auVar222 = vinsertps_avx(local_960._0_16_,auVar124,0x10);
                auVar229 = ZEXT1664(auVar222);
                auVar157._0_4_ = auVar222._0_4_ * auVar99._0_4_;
                auVar157._4_4_ = auVar222._4_4_ * auVar99._4_4_;
                auVar157._8_4_ = auVar222._8_4_ * auVar99._8_4_;
                auVar157._12_4_ = auVar222._12_4_ * auVar99._12_4_;
                auVar99 = vinsertps_avx(auVar199,local_a40._0_16_,0x1c);
                auVar99 = vdivps_avx(auVar99,auVar179);
                auVar180._0_4_ = auVar222._0_4_ * auVar99._0_4_;
                auVar180._4_4_ = auVar222._4_4_ * auVar99._4_4_;
                auVar180._8_4_ = auVar222._8_4_ * auVar99._8_4_;
                auVar180._12_4_ = auVar222._12_4_ * auVar99._12_4_;
                auVar99 = vhaddps_avx(auVar157,auVar157);
                auVar198 = vhaddps_avx(auVar180,auVar180);
                fVar150 = (float)local_ae0._0_4_ - auVar99._0_4_;
                auVar249 = ZEXT464((uint)fVar150);
                fVar149 = (float)local_ac0._0_4_ - auVar198._0_4_;
                uVar87 = 0;
                uVar277 = 0;
                uVar278 = 0;
                auVar99 = vandps_avx(local_960._0_16_,local_6e0._0_16_);
                fVar91 = (float)local_900._4_4_;
                fVar147 = fStack_8f8;
                fVar281 = fStack_8f4;
                fVar152 = fStack_8f0;
                fVar148 = fStack_8ec;
                fVar284 = fStack_8e8;
                fVar116 = (float)local_900._0_4_;
                if ((float)local_840._0_4_ <= auVar99._0_4_) {
LAB_01922383:
                  bVar61 = false;
                }
                else {
                  auVar198 = vfmadd231ss_fma(ZEXT416((uint)((float)local_840._0_4_ +
                                                           (float)local_920._0_4_)),_local_780,
                                             ZEXT416(0x36000000));
                  auVar99 = vandps_avx(auVar124,local_6e0._0_16_);
                  if (auVar198._0_4_ <= auVar99._0_4_) goto LAB_01922383;
                  fVar149 = fVar149 + (float)local_7c0._0_4_;
                  uVar87 = 0;
                  uVar277 = 0;
                  uVar278 = 0;
                  bVar61 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar149) &&
                       (fVar287 = (ray->super_RayK<1>).tfar, fVar149 <= fVar287)) &&
                      (0.0 <= fVar150)) && (fVar150 <= 1.0)) {
                    auVar99 = vrsqrtss_avx(local_aa0._0_16_,local_aa0._0_16_);
                    fVar151 = auVar99._0_4_;
                    pGVar7 = (context->scene->geometries).items[local_ae8].ptr;
                    if ((pGVar7->mask & (ray->super_RayK<1>).mask) != 0) {
                      fVar151 = fVar151 * 1.5 + local_aa0._0_4_ * -0.5 * fVar151 * fVar151 * fVar151
                      ;
                      auVar125._0_4_ = fVar151 * (float)local_800._0_4_;
                      auVar125._4_4_ = fVar151 * (float)local_800._4_4_;
                      auVar125._8_4_ = fVar151 * fStack_7f8;
                      auVar125._12_4_ = fVar151 * fStack_7f4;
                      auVar4 = vfmadd213ps_fma(auVar4,auVar125,local_880._0_16_);
                      auVar99 = vshufps_avx(auVar125,auVar125,0xc9);
                      auVar198 = vshufps_avx(local_880._0_16_,local_880._0_16_,0xc9);
                      auVar126._0_4_ = auVar125._0_4_ * auVar198._0_4_;
                      auVar126._4_4_ = auVar125._4_4_ * auVar198._4_4_;
                      auVar126._8_4_ = auVar125._8_4_ * auVar198._8_4_;
                      auVar126._12_4_ = auVar125._12_4_ * auVar198._12_4_;
                      auVar124 = vfmsub231ps_fma(auVar126,local_880._0_16_,auVar99);
                      auVar99 = vshufps_avx(auVar124,auVar124,0xc9);
                      auVar198 = vshufps_avx(auVar4,auVar4,0xc9);
                      auVar124 = vshufps_avx(auVar124,auVar124,0xd2);
                      auVar97._0_4_ = auVar4._0_4_ * auVar124._0_4_;
                      auVar97._4_4_ = auVar4._4_4_ * auVar124._4_4_;
                      auVar97._8_4_ = auVar4._8_4_ * auVar124._8_4_;
                      auVar97._12_4_ = auVar4._12_4_ * auVar124._12_4_;
                      auVar99 = vfmsub231ps_fma(auVar97,auVar99,auVar198);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar149;
                        auVar198 = vshufps_avx(auVar99,auVar99,0xe9);
                        uVar153 = vmovlps_avx(auVar198);
                        *(undefined8 *)&(ray->Ng).field_0 = uVar153;
                        (ray->Ng).field_0.field_0.z = auVar99._0_4_;
                        ray->u = fVar150;
                        ray->v = 0.0;
                        ray->primID = (uint)local_a78;
                        ray->geomID = (uint)local_ae8;
                        ray->instID[0] = context->user->instID[0];
                        ray->instPrimID[0] = context->user->instPrimID[0];
                      }
                      else {
                        auVar198 = vshufps_avx(auVar99,auVar99,0xe9);
                        local_9d0 = vmovlps_avx(auVar198);
                        local_9c8 = auVar99._0_4_;
                        local_9c4 = fVar150;
                        local_9c0 = 0;
                        local_9bc = (uint)local_a78;
                        local_9b8 = (uint)local_ae8;
                        local_9b4 = context->user->instID[0];
                        local_9b0 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar149;
                        local_aec = -1;
                        local_a70.valid = &local_aec;
                        local_a70.geometryUserPtr = pGVar7->userPtr;
                        local_a70.context = context->user;
                        local_a70.ray = (RTCRayN *)ray;
                        local_a70.hit = (RTCHitN *)&local_9d0;
                        local_a70.N = 1;
                        local_ae0._0_16_ = ZEXT416((uint)fVar150);
                        local_ac0._0_16_ = ZEXT416((uint)fVar149);
                        local_aa0._0_4_ = fVar287;
                        if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_019224d1:
                          p_Var11 = context->args->filter;
                          fVar116 = (float)local_900._0_4_;
                          fVar91 = (float)local_900._4_4_;
                          fVar147 = fStack_8f8;
                          fVar281 = fStack_8f4;
                          fVar152 = fStack_8f0;
                          fVar148 = fStack_8ec;
                          fVar284 = fStack_8e8;
                          if (p_Var11 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                              auVar229 = ZEXT1664(auVar229._0_16_);
                              auVar240 = ZEXT1664(auVar240._0_16_);
                              auVar254 = ZEXT1664(auVar254._0_16_);
                              (*p_Var11)(&local_a70);
                              auVar249 = ZEXT1664(local_ae0._0_16_);
                              auVar266 = ZEXT3264(local_8e0);
                              auVar258 = ZEXT3264(local_8c0);
                              auVar210 = ZEXT3264(local_9a0);
                              fVar287 = (float)local_aa0._0_4_;
                              fVar149 = (float)local_ac0._0_4_;
                              uVar87 = local_ac0._4_4_;
                              uVar277 = local_ac0._8_4_;
                              uVar278 = local_ac0._12_4_;
                              fVar116 = (float)local_900._0_4_;
                              fVar91 = (float)local_900._4_4_;
                              fVar147 = fStack_8f8;
                              fVar281 = fStack_8f4;
                              fVar152 = fStack_8f0;
                              fVar148 = fStack_8ec;
                              fVar284 = fStack_8e8;
                            }
                            if (*local_a70.valid == 0) goto LAB_0192259b;
                          }
                          (((Vec3f *)((long)local_a70.ray + 0x30))->field_0).components[0] =
                               *(float *)local_a70.hit;
                          (((Vec3f *)((long)local_a70.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_a70.hit + 4);
                          (((Vec3f *)((long)local_a70.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_a70.hit + 8);
                          *(float *)((long)local_a70.ray + 0x3c) = *(float *)(local_a70.hit + 0xc);
                          *(float *)((long)local_a70.ray + 0x40) = *(float *)(local_a70.hit + 0x10);
                          *(float *)((long)local_a70.ray + 0x44) = *(float *)(local_a70.hit + 0x14);
                          *(float *)((long)local_a70.ray + 0x48) = *(float *)(local_a70.hit + 0x18);
                          *(float *)((long)local_a70.ray + 0x4c) = *(float *)(local_a70.hit + 0x1c);
                          *(float *)((long)local_a70.ray + 0x50) = *(float *)(local_a70.hit + 0x20);
                        }
                        else {
                          auVar229 = ZEXT1664(auVar222);
                          auVar240 = ZEXT1664(local_a40._0_16_);
                          auVar254 = ZEXT1664(local_960._0_16_);
                          (*pGVar7->intersectionFilterN)(&local_a70);
                          auVar249 = ZEXT1664(local_ae0._0_16_);
                          auVar266 = ZEXT3264(local_8e0);
                          auVar258 = ZEXT3264(local_8c0);
                          auVar210 = ZEXT3264(local_9a0);
                          fVar287 = (float)local_aa0._0_4_;
                          fVar149 = (float)local_ac0._0_4_;
                          uVar87 = local_ac0._4_4_;
                          uVar277 = local_ac0._8_4_;
                          uVar278 = local_ac0._12_4_;
                          fVar116 = (float)local_900._0_4_;
                          fVar91 = (float)local_900._4_4_;
                          fVar147 = fStack_8f8;
                          fVar281 = fStack_8f4;
                          fVar152 = fStack_8f0;
                          fVar148 = fStack_8ec;
                          fVar284 = fStack_8e8;
                          if (*local_a70.valid != 0) goto LAB_019224d1;
LAB_0192259b:
                          (ray->super_RayK<1>).tfar = fVar287;
                        }
                      }
                    }
                  }
                }
                auVar109 = local_5c0;
                bVar90 = lVar89 != 0;
                lVar89 = lVar89 + -1;
              } while ((!bVar61) && (bVar90));
              fVar149 = (ray->super_RayK<1>).tfar;
              auVar110._4_4_ = fVar149;
              auVar110._0_4_ = fVar149;
              auVar110._8_4_ = fVar149;
              auVar110._12_4_ = fVar149;
              auVar110._16_4_ = fVar149;
              auVar110._20_4_ = fVar149;
              auVar110._24_4_ = fVar149;
              auVar110._28_4_ = fVar149;
              auVar102 = vcmpps_avx(_local_580,auVar110,2);
              local_5c0 = vandps_avx(auVar102,local_5c0);
              auVar194 = ZEXT3264(local_5c0);
              auVar109 = auVar109 & auVar102;
              uVar88 = local_660._0_8_;
            } while ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar109 >> 0x7f,0) != '\0') ||
                       (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar109 >> 0xbf,0) != '\0') ||
                     (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar109[0x1f] < '\0');
          }
          auVar115._0_4_ = fVar116 * (float)local_6a0._0_4_;
          auVar115._4_4_ = fVar91 * (float)local_6a0._4_4_;
          auVar115._8_4_ = fVar147 * fStack_698;
          auVar115._12_4_ = fVar281 * fStack_694;
          auVar115._16_4_ = fVar152 * fStack_690;
          auVar115._20_4_ = fVar148 * fStack_68c;
          auVar115._28_36_ = auVar194._28_36_;
          auVar115._24_4_ = fVar284 * fStack_688;
          auVar99 = vfmadd213ps_fma(local_680,auVar266._0_32_,auVar115._0_32_);
          auVar99 = vfmadd213ps_fma(local_4a0,auVar258._0_32_,ZEXT1632(auVar99));
          auVar109 = vandps_avx(ZEXT1632(auVar99),local_7a0);
          auVar139._8_4_ = 0x3e99999a;
          auVar139._0_8_ = 0x3e99999a3e99999a;
          auVar139._12_4_ = 0x3e99999a;
          auVar139._16_4_ = 0x3e99999a;
          auVar139._20_4_ = 0x3e99999a;
          auVar139._24_4_ = 0x3e99999a;
          auVar139._28_4_ = 0x3e99999a;
          auVar109 = vcmpps_avx(auVar109,auVar139,1);
          auVar102 = vorps_avx(auVar109,local_400);
          auVar140._0_4_ = (float)local_3c0._0_4_ + (float)local_760._0_4_;
          auVar140._4_4_ = (float)local_3c0._4_4_ + (float)local_760._4_4_;
          auVar140._8_4_ = fStack_3b8 + fStack_758;
          auVar140._12_4_ = fStack_3b4 + fStack_754;
          auVar140._16_4_ = fStack_3b0 + fStack_750;
          auVar140._20_4_ = fStack_3ac + fStack_74c;
          auVar140._24_4_ = fStack_3a8 + fStack_748;
          auVar140._28_4_ = fStack_3a4 + fStack_744;
          fVar116 = (ray->super_RayK<1>).tfar;
          auVar166._4_4_ = fVar116;
          auVar166._0_4_ = fVar116;
          auVar166._8_4_ = fVar116;
          auVar166._12_4_ = fVar116;
          auVar166._16_4_ = fVar116;
          auVar166._20_4_ = fVar116;
          auVar166._24_4_ = fVar116;
          auVar166._28_4_ = fVar116;
          auVar109 = vcmpps_avx(auVar140,auVar166,2);
          local_740 = vandps_avx(auVar109,local_3e0);
          auVar141._8_4_ = 3;
          auVar141._0_8_ = 0x300000003;
          auVar141._12_4_ = 3;
          auVar141._16_4_ = 3;
          auVar141._20_4_ = 3;
          auVar141._24_4_ = 3;
          auVar141._28_4_ = 3;
          auVar167._8_4_ = 2;
          auVar167._0_8_ = 0x200000002;
          auVar167._12_4_ = 2;
          auVar167._16_4_ = 2;
          auVar167._20_4_ = 2;
          auVar167._24_4_ = 2;
          auVar167._28_4_ = 2;
          auVar109 = vblendvps_avx(auVar167,auVar141,auVar102);
          _local_780 = vpcmpgtd_avx2(auVar109,local_420);
          local_5e0 = vpandn_avx2(_local_780,local_740);
          auVar109 = local_740 & ~_local_780;
          if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar109 >> 0x7f,0) != '\0') ||
                (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar109 >> 0xbf,0) != '\0') ||
              (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar109[0x1f] < '\0') {
            auVar198 = vminps_avx(local_9e0,local_a00);
            auVar99 = vmaxps_avx(local_9e0,local_a00);
            auVar222 = vminps_avx(local_9f0,_local_a10);
            auVar124 = vminps_avx(auVar198,auVar222);
            auVar198 = vmaxps_avx(local_9f0,_local_a10);
            auVar222 = vmaxps_avx(auVar99,auVar198);
            local_840._8_4_ = 0x7fffffff;
            local_840._0_8_ = 0x7fffffff7fffffff;
            local_840._12_4_ = 0x7fffffff;
            auVar99 = vandps_avx(auVar124,local_840._0_16_);
            auVar198 = vandps_avx(auVar222,local_840._0_16_);
            auVar99 = vmaxps_avx(auVar99,auVar198);
            auVar198 = vmovshdup_avx(auVar99);
            auVar198 = vmaxss_avx(auVar198,auVar99);
            auVar99 = vshufpd_avx(auVar99,auVar99,1);
            auVar99 = vmaxss_avx(auVar99,auVar198);
            local_820._0_4_ = auVar99._0_4_ * 1.9073486e-06;
            local_6e0._0_16_ = vshufps_avx(auVar222,auVar222,0xff);
            local_700 = _local_520;
            local_720._4_4_ = (float)local_520._4_4_ + (float)local_760._4_4_;
            local_720._0_4_ = (float)local_520._0_4_ + (float)local_760._0_4_;
            fStack_718 = fStack_518 + fStack_758;
            fStack_714 = fStack_514 + fStack_754;
            fStack_710 = fStack_510 + fStack_750;
            fStack_70c = fStack_50c + fStack_74c;
            fStack_708 = fStack_508 + fStack_748;
            fStack_704 = fStack_504 + fStack_744;
            do {
              auVar142._8_4_ = 0x7f800000;
              auVar142._0_8_ = 0x7f8000007f800000;
              auVar142._12_4_ = 0x7f800000;
              auVar142._16_4_ = 0x7f800000;
              auVar142._20_4_ = 0x7f800000;
              auVar142._24_4_ = 0x7f800000;
              auVar142._28_4_ = 0x7f800000;
              auVar109 = vblendvps_avx(auVar142,local_700,local_5e0);
              auVar102 = vshufps_avx(auVar109,auVar109,0xb1);
              auVar102 = vminps_avx(auVar109,auVar102);
              auVar145 = vshufpd_avx(auVar102,auVar102,5);
              auVar102 = vminps_avx(auVar102,auVar145);
              auVar145 = vpermpd_avx2(auVar102,0x4e);
              auVar102 = vminps_avx(auVar102,auVar145);
              auVar102 = vcmpps_avx(auVar109,auVar102,0);
              auVar145 = local_5e0 & auVar102;
              auVar109 = local_5e0;
              if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar145 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar145 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar145 >> 0x7f,0) != '\0') ||
                    (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar145 >> 0xbf,0) != '\0') ||
                  (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar145[0x1f] < '\0') {
                auVar109 = vandps_avx(auVar102,local_5e0);
              }
              uVar83 = vmovmskps_avx(auVar109);
              iVar18 = 0;
              for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
                iVar18 = iVar18 + 1;
              }
              uVar83 = iVar18 << 2;
              *(undefined4 *)(local_5e0 + uVar83) = 0;
              aVar2 = (ray->super_RayK<1>).dir.field_0;
              _local_800 = (undefined1  [16])aVar2;
              auVar99 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
              auVar194 = ZEXT464(*(uint *)(local_560 + uVar83));
              auVar240 = ZEXT464(*(uint *)(local_500 + uVar83));
              if (auVar99._0_4_ < 0.0) {
                local_ae0._0_16_ = ZEXT416(*(uint *)(local_560 + uVar83));
                local_ac0._0_16_ = ZEXT416(*(uint *)(local_500 + uVar83));
                fVar116 = sqrtf(auVar99._0_4_);
                auVar240 = ZEXT1664(local_ac0._0_16_);
                auVar194 = ZEXT1664(local_ae0._0_16_);
              }
              else {
                auVar99 = vsqrtss_avx(auVar99,auVar99);
                fVar116 = auVar99._0_4_;
              }
              local_960._0_4_ = fVar116 * 1.9073486e-06;
              lVar89 = 4;
              do {
                fVar91 = auVar194._0_4_;
                fVar116 = 1.0 - fVar91;
                local_940._0_16_ = ZEXT416((uint)fVar116);
                auVar127._0_4_ = local_a00._0_4_ * fVar91;
                auVar127._4_4_ = local_a00._4_4_ * fVar91;
                auVar127._8_4_ = local_a00._8_4_ * fVar91;
                auVar127._12_4_ = local_a00._12_4_ * fVar91;
                auVar158._4_4_ = fVar116;
                auVar158._0_4_ = fVar116;
                auVar158._8_4_ = fVar116;
                auVar158._12_4_ = fVar116;
                auVar99 = vfmadd231ps_fma(auVar127,auVar158,local_9e0);
                auVar181._0_4_ = local_9f0._0_4_ * fVar91;
                auVar181._4_4_ = local_9f0._4_4_ * fVar91;
                auVar181._8_4_ = local_9f0._8_4_ * fVar91;
                auVar181._12_4_ = local_9f0._12_4_ * fVar91;
                auVar198 = vfmadd231ps_fma(auVar181,auVar158,local_a00);
                auVar221._0_4_ = fVar91 * auVar198._0_4_;
                auVar221._4_4_ = fVar91 * auVar198._4_4_;
                auVar221._8_4_ = fVar91 * auVar198._8_4_;
                auVar221._12_4_ = fVar91 * auVar198._12_4_;
                auVar222 = vfmadd231ps_fma(auVar221,auVar158,auVar99);
                auVar128._0_4_ = fVar91 * (float)local_a10._0_4_;
                auVar128._4_4_ = fVar91 * (float)local_a10._4_4_;
                auVar128._8_4_ = fVar91 * fStack_a08;
                auVar128._12_4_ = fVar91 * fStack_a04;
                auVar99 = vfmadd231ps_fma(auVar128,auVar158,local_9f0);
                auVar200._0_4_ = fVar91 * auVar99._0_4_;
                auVar200._4_4_ = fVar91 * auVar99._4_4_;
                auVar200._8_4_ = fVar91 * auVar99._8_4_;
                auVar200._12_4_ = fVar91 * auVar99._12_4_;
                auVar198 = vfmadd231ps_fma(auVar200,auVar158,auVar198);
                uVar87 = auVar240._0_4_;
                auVar129._4_4_ = uVar87;
                auVar129._0_4_ = uVar87;
                auVar129._8_4_ = uVar87;
                auVar129._12_4_ = uVar87;
                auVar99 = vfmadd213ps_fma(auVar129,_local_800,_DAT_01feba10);
                auVar98._0_4_ = fVar91 * auVar198._0_4_;
                auVar98._4_4_ = fVar91 * auVar198._4_4_;
                auVar98._8_4_ = fVar91 * auVar198._8_4_;
                auVar98._12_4_ = fVar91 * auVar198._12_4_;
                auVar124 = vfmadd231ps_fma(auVar98,auVar222,auVar158);
                local_880._0_16_ = auVar124;
                auVar99 = vsubps_avx(auVar99,auVar124);
                _local_920 = auVar99;
                auVar99 = vdpps_avx(auVar99,auVar99,0x7f);
                local_ae0._0_16_ = auVar194._0_16_;
                local_ac0._0_16_ = auVar240._0_16_;
                local_aa0._0_16_ = auVar99;
                if (auVar99._0_4_ < 0.0) {
                  local_940._0_16_ = ZEXT416((uint)fVar116);
                  local_8a0._0_16_ = auVar222;
                  local_a40._0_16_ = auVar198;
                  auVar249._0_4_ = sqrtf(auVar99._0_4_);
                  auVar249._4_60_ = extraout_var_00;
                  auVar240 = ZEXT1664(local_ac0._0_16_);
                  auVar99 = auVar249._0_16_;
                  auVar198 = local_a40._0_16_;
                  auVar222 = local_8a0._0_16_;
                  auVar124 = local_ae0._0_16_;
                }
                else {
                  auVar99 = vsqrtss_avx(auVar99,auVar99);
                  auVar124 = auVar194._0_16_;
                }
                auVar198 = vsubps_avx(auVar198,auVar222);
                auVar243._0_4_ = auVar198._0_4_ * 3.0;
                auVar243._4_4_ = auVar198._4_4_ * 3.0;
                auVar243._8_4_ = auVar198._8_4_ * 3.0;
                auVar243._12_4_ = auVar198._12_4_ * 3.0;
                auVar198 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_940._0_16_,auVar124)
                ;
                auVar222 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar124,local_940._0_16_)
                ;
                fVar116 = local_940._0_4_ * 6.0;
                fVar91 = auVar198._0_4_ * 6.0;
                fVar147 = auVar222._0_4_ * 6.0;
                fVar281 = auVar124._0_4_ * 6.0;
                auVar182._0_4_ = fVar281 * (float)local_a10._0_4_;
                auVar182._4_4_ = fVar281 * (float)local_a10._4_4_;
                auVar182._8_4_ = fVar281 * fStack_a08;
                auVar182._12_4_ = fVar281 * fStack_a04;
                auVar130._4_4_ = fVar147;
                auVar130._0_4_ = fVar147;
                auVar130._8_4_ = fVar147;
                auVar130._12_4_ = fVar147;
                auVar198 = vfmadd132ps_fma(auVar130,auVar182,local_9f0);
                auVar183._4_4_ = fVar91;
                auVar183._0_4_ = fVar91;
                auVar183._8_4_ = fVar91;
                auVar183._12_4_ = fVar91;
                auVar198 = vfmadd132ps_fma(auVar183,auVar198,local_a00);
                auVar222 = vdpps_avx(auVar243,auVar243,0x7f);
                auVar131._4_4_ = fVar116;
                auVar131._0_4_ = fVar116;
                auVar131._8_4_ = fVar116;
                auVar131._12_4_ = fVar116;
                auVar4 = vfmadd132ps_fma(auVar131,auVar198,local_9e0);
                auVar198 = vblendps_avx(auVar222,_DAT_01feba10,0xe);
                auVar124 = vrsqrtss_avx(auVar198,auVar198);
                fVar147 = auVar222._0_4_;
                fVar116 = auVar124._0_4_;
                auVar124 = vdpps_avx(auVar243,auVar4,0x7f);
                fVar116 = fVar116 * 1.5 + fVar147 * -0.5 * fVar116 * fVar116 * fVar116;
                auVar132._0_4_ = auVar4._0_4_ * fVar147;
                auVar132._4_4_ = auVar4._4_4_ * fVar147;
                auVar132._8_4_ = auVar4._8_4_ * fVar147;
                auVar132._12_4_ = auVar4._12_4_ * fVar147;
                fVar91 = auVar124._0_4_;
                auVar223._0_4_ = auVar243._0_4_ * fVar91;
                auVar223._4_4_ = auVar243._4_4_ * fVar91;
                auVar223._8_4_ = auVar243._8_4_ * fVar91;
                auVar223._12_4_ = auVar243._12_4_ * fVar91;
                auVar124 = vsubps_avx(auVar132,auVar223);
                auVar198 = vrcpss_avx(auVar198,auVar198);
                auVar4 = vfnmadd213ss_fma(auVar198,auVar222,ZEXT416(0x40000000));
                fVar91 = auVar198._0_4_ * auVar4._0_4_;
                auVar198 = vmaxss_avx(ZEXT416((uint)local_820._0_4_),
                                      ZEXT416((uint)(auVar240._0_4_ * (float)local_960._0_4_)));
                auVar258 = ZEXT1664(auVar198);
                uVar88 = CONCAT44(auVar243._4_4_,auVar243._0_4_);
                auVar230._0_8_ = uVar88 ^ 0x8000000080000000;
                auVar230._8_4_ = -auVar243._8_4_;
                auVar230._12_4_ = -auVar243._12_4_;
                auVar184._0_4_ = fVar116 * auVar124._0_4_ * fVar91;
                auVar184._4_4_ = fVar116 * auVar124._4_4_ * fVar91;
                auVar184._8_4_ = fVar116 * auVar124._8_4_ * fVar91;
                auVar184._12_4_ = fVar116 * auVar124._12_4_ * fVar91;
                auVar235._0_4_ = auVar243._0_4_ * fVar116;
                auVar235._4_4_ = auVar243._4_4_ * fVar116;
                auVar235._8_4_ = auVar243._8_4_ * fVar116;
                auVar235._12_4_ = auVar243._12_4_ * fVar116;
                local_940._0_16_ = auVar243;
                local_8a0._0_4_ = auVar198._0_4_;
                if (fVar147 < -fVar147) {
                  local_a40._0_4_ = auVar99._0_4_;
                  local_980._0_16_ = auVar230;
                  local_860._0_16_ = auVar235;
                  local_9a0._0_16_ = auVar184;
                  fVar116 = sqrtf(fVar147);
                  auVar99 = ZEXT416((uint)local_a40._0_4_);
                  auVar258 = ZEXT464((uint)local_8a0._0_4_);
                  auVar184 = local_9a0._0_16_;
                  auVar230 = local_980._0_16_;
                  auVar235 = local_860._0_16_;
                }
                else {
                  auVar198 = vsqrtss_avx(auVar222,auVar222);
                  fVar116 = auVar198._0_4_;
                }
                auVar198 = vdpps_avx(_local_920,auVar235,0x7f);
                auVar272 = vfmadd213ss_fma(ZEXT416((uint)local_820._0_4_),auVar99,auVar258._0_16_);
                auVar222 = vdpps_avx(auVar230,auVar235,0x7f);
                auVar124 = vdpps_avx(_local_920,auVar184,0x7f);
                auVar4 = vdpps_avx(_local_800,auVar235,0x7f);
                auVar272 = vfmadd213ss_fma(ZEXT416((uint)(auVar99._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_820._0_4_ / fVar116)),
                                           auVar272);
                auVar266 = ZEXT1664(auVar272);
                fVar116 = auVar222._0_4_ + auVar124._0_4_;
                auVar100._0_4_ = auVar198._0_4_ * auVar198._0_4_;
                auVar100._4_4_ = auVar198._4_4_ * auVar198._4_4_;
                auVar100._8_4_ = auVar198._8_4_ * auVar198._8_4_;
                auVar100._12_4_ = auVar198._12_4_ * auVar198._12_4_;
                auVar99 = vdpps_avx(_local_920,auVar230,0x7f);
                auVar124 = vsubps_avx(local_aa0._0_16_,auVar100);
                auVar222 = vrsqrtss_avx(auVar124,auVar124);
                fVar147 = auVar124._0_4_;
                fVar91 = auVar222._0_4_;
                fVar91 = fVar91 * 1.5 + fVar147 * -0.5 * fVar91 * fVar91 * fVar91;
                auVar222 = vdpps_avx(_local_920,_local_800,0x7f);
                auVar99 = vfnmadd231ss_fma(auVar99,auVar198,ZEXT416((uint)fVar116));
                auVar222 = vfnmadd231ss_fma(auVar222,auVar198,auVar4);
                if (fVar147 < 0.0) {
                  local_a40._0_16_ = auVar198;
                  local_980._0_4_ = auVar272._0_4_;
                  local_860._0_16_ = ZEXT416((uint)fVar116);
                  local_9a0._0_16_ = auVar4;
                  local_8c0._0_16_ = auVar99;
                  local_8e0._0_4_ = fVar91;
                  _local_900 = auVar222;
                  fVar147 = sqrtf(fVar147);
                  auVar266 = ZEXT464((uint)local_980._0_4_);
                  auVar258 = ZEXT464((uint)local_8a0._0_4_);
                  fVar91 = (float)local_8e0._0_4_;
                  auVar222 = _local_900;
                  auVar124 = local_aa0._0_16_;
                  auVar198 = local_a40._0_16_;
                  auVar4 = local_9a0._0_16_;
                  auVar99 = local_8c0._0_16_;
                  auVar272 = local_860._0_16_;
                }
                else {
                  auVar124 = vsqrtss_avx(auVar124,auVar124);
                  fVar147 = auVar124._0_4_;
                  auVar124 = local_aa0._0_16_;
                  auVar272 = ZEXT416((uint)fVar116);
                }
                auVar254 = ZEXT1664(auVar124);
                auVar249 = ZEXT1664(local_940._0_16_);
                auVar133 = vpermilps_avx(local_880._0_16_,0xff);
                auVar5 = vshufps_avx(local_940._0_16_,local_940._0_16_,0xff);
                auVar99 = vfmsub213ss_fma(auVar99,ZEXT416((uint)fVar91),auVar5);
                auVar185._0_8_ = auVar4._0_8_ ^ 0x8000000080000000;
                auVar185._8_4_ = auVar4._8_4_ ^ 0x80000000;
                auVar185._12_4_ = auVar4._12_4_ ^ 0x80000000;
                auVar201._0_8_ = auVar99._0_8_ ^ 0x8000000080000000;
                auVar201._8_4_ = auVar99._8_4_ ^ 0x80000000;
                auVar201._12_4_ = auVar99._12_4_ ^ 0x80000000;
                auVar159 = ZEXT416((uint)(auVar222._0_4_ * fVar91));
                auVar222 = vfmsub231ss_fma(ZEXT416((uint)(auVar4._0_4_ * auVar99._0_4_)),auVar272,
                                           auVar159);
                auVar99 = vinsertps_avx(auVar159,auVar185,0x10);
                uVar87 = auVar222._0_4_;
                auVar186._4_4_ = uVar87;
                auVar186._0_4_ = uVar87;
                auVar186._8_4_ = uVar87;
                auVar186._12_4_ = uVar87;
                auVar99 = vdivps_avx(auVar99,auVar186);
                auVar133 = ZEXT416((uint)(fVar147 - auVar133._0_4_));
                auVar4 = vinsertps_avx(auVar198,auVar133,0x10);
                auVar229 = ZEXT1664(auVar4);
                auVar160._0_4_ = auVar4._0_4_ * auVar99._0_4_;
                auVar160._4_4_ = auVar4._4_4_ * auVar99._4_4_;
                auVar160._8_4_ = auVar4._8_4_ * auVar99._8_4_;
                auVar160._12_4_ = auVar4._12_4_ * auVar99._12_4_;
                auVar99 = vinsertps_avx(auVar201,auVar272,0x1c);
                auVar99 = vdivps_avx(auVar99,auVar186);
                auVar187._0_4_ = auVar4._0_4_ * auVar99._0_4_;
                auVar187._4_4_ = auVar4._4_4_ * auVar99._4_4_;
                auVar187._8_4_ = auVar4._8_4_ * auVar99._8_4_;
                auVar187._12_4_ = auVar4._12_4_ * auVar99._12_4_;
                auVar99 = vhaddps_avx(auVar160,auVar160);
                auVar222 = vhaddps_avx(auVar187,auVar187);
                fVar91 = (float)local_ae0._0_4_ - auVar99._0_4_;
                auVar194 = ZEXT464((uint)fVar91);
                fVar116 = (float)local_ac0._0_4_ - auVar222._0_4_;
                auVar240 = ZEXT464((uint)fVar116);
                auVar99 = vandps_avx(auVar198,local_840._0_16_);
                if (auVar266._0_4_ <= auVar99._0_4_) {
LAB_01922dee:
                  bVar61 = false;
                }
                else {
                  auVar198 = vfmadd231ss_fma(ZEXT416((uint)(auVar258._0_4_ + auVar266._0_4_)),
                                             local_6e0._0_16_,ZEXT416(0x36000000));
                  auVar99 = vandps_avx(auVar133,local_840._0_16_);
                  if (auVar198._0_4_ <= auVar99._0_4_) goto LAB_01922dee;
                  fVar116 = fVar116 + (float)local_7c0._0_4_;
                  auVar240 = ZEXT464((uint)fVar116);
                  bVar61 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar116) &&
                       (fVar147 = (ray->super_RayK<1>).tfar, fVar116 <= fVar147)) && (0.0 <= fVar91)
                      ) && (fVar91 <= 1.0)) {
                    auVar99 = vrsqrtss_avx(auVar124,auVar124);
                    fVar281 = auVar99._0_4_;
                    pGVar7 = (context->scene->geometries).items[local_ae8].ptr;
                    if ((pGVar7->mask & (ray->super_RayK<1>).mask) != 0) {
                      fVar281 = fVar281 * 1.5 + auVar124._0_4_ * -0.5 * fVar281 * fVar281 * fVar281;
                      auVar134._0_4_ = fVar281 * (float)local_920._0_4_;
                      auVar134._4_4_ = fVar281 * (float)local_920._4_4_;
                      auVar134._8_4_ = fVar281 * fStack_918;
                      auVar134._12_4_ = fVar281 * fStack_914;
                      auVar272 = vfmadd213ps_fma(auVar5,auVar134,local_940._0_16_);
                      auVar99 = vshufps_avx(auVar134,auVar134,0xc9);
                      auVar198 = vshufps_avx(local_940._0_16_,local_940._0_16_,0xc9);
                      auVar135._0_4_ = auVar134._0_4_ * auVar198._0_4_;
                      auVar135._4_4_ = auVar134._4_4_ * auVar198._4_4_;
                      auVar135._8_4_ = auVar134._8_4_ * auVar198._8_4_;
                      auVar135._12_4_ = auVar134._12_4_ * auVar198._12_4_;
                      auVar222 = vfmsub231ps_fma(auVar135,local_940._0_16_,auVar99);
                      auVar99 = vshufps_avx(auVar222,auVar222,0xc9);
                      auVar198 = vshufps_avx(auVar272,auVar272,0xc9);
                      auVar222 = vshufps_avx(auVar222,auVar222,0xd2);
                      auVar101._0_4_ = auVar272._0_4_ * auVar222._0_4_;
                      auVar101._4_4_ = auVar272._4_4_ * auVar222._4_4_;
                      auVar101._8_4_ = auVar272._8_4_ * auVar222._8_4_;
                      auVar101._12_4_ = auVar272._12_4_ * auVar222._12_4_;
                      auVar99 = vfmsub231ps_fma(auVar101,auVar99,auVar198);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar116;
                        auVar198 = vshufps_avx(auVar99,auVar99,0xe9);
                        uVar153 = vmovlps_avx(auVar198);
                        *(undefined8 *)&(ray->Ng).field_0 = uVar153;
                        (ray->Ng).field_0.field_0.z = auVar99._0_4_;
                        ray->u = fVar91;
                        ray->v = 0.0;
                        ray->primID = (uint)local_a78;
                        ray->geomID = (uint)local_ae8;
                        ray->instID[0] = context->user->instID[0];
                        ray->instPrimID[0] = context->user->instPrimID[0];
                      }
                      else {
                        auVar198 = vshufps_avx(auVar99,auVar99,0xe9);
                        local_9d0 = vmovlps_avx(auVar198);
                        local_9c8 = auVar99._0_4_;
                        local_9c4 = fVar91;
                        local_9c0 = 0;
                        local_9bc = (uint)local_a78;
                        local_9b8 = (uint)local_ae8;
                        local_9b4 = context->user->instID[0];
                        local_9b0 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar116;
                        local_aec = -1;
                        local_a70.valid = &local_aec;
                        local_a70.geometryUserPtr = pGVar7->userPtr;
                        local_a70.context = context->user;
                        local_a70.ray = (RTCRayN *)ray;
                        local_a70.hit = (RTCHitN *)&local_9d0;
                        local_a70.N = 1;
                        local_ae0._0_16_ = ZEXT416((uint)fVar91);
                        local_ac0._0_16_ = ZEXT416((uint)fVar116);
                        local_aa0._0_4_ = fVar147;
                        if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01922f18:
                          p_Var11 = context->args->filter;
                          if (p_Var11 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                              auVar229 = ZEXT1664(auVar229._0_16_);
                              auVar249 = ZEXT1664(auVar249._0_16_);
                              auVar254 = ZEXT1664(auVar254._0_16_);
                              auVar258 = ZEXT1664(auVar258._0_16_);
                              auVar266 = ZEXT1664(auVar266._0_16_);
                              (*p_Var11)(&local_a70);
                              auVar240 = ZEXT1664(local_ac0._0_16_);
                              auVar194 = ZEXT1664(local_ae0._0_16_);
                              fVar147 = (float)local_aa0._0_4_;
                            }
                            if (*local_a70.valid == 0) goto LAB_01922fbe;
                          }
                          (((Vec3f *)((long)local_a70.ray + 0x30))->field_0).components[0] =
                               *(float *)local_a70.hit;
                          (((Vec3f *)((long)local_a70.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_a70.hit + 4);
                          (((Vec3f *)((long)local_a70.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_a70.hit + 8);
                          *(float *)((long)local_a70.ray + 0x3c) = *(float *)(local_a70.hit + 0xc);
                          *(float *)((long)local_a70.ray + 0x40) = *(float *)(local_a70.hit + 0x10);
                          *(float *)((long)local_a70.ray + 0x44) = *(float *)(local_a70.hit + 0x14);
                          *(float *)((long)local_a70.ray + 0x48) = *(float *)(local_a70.hit + 0x18);
                          *(float *)((long)local_a70.ray + 0x4c) = *(float *)(local_a70.hit + 0x1c);
                          *(float *)((long)local_a70.ray + 0x50) = *(float *)(local_a70.hit + 0x20);
                        }
                        else {
                          auVar229 = ZEXT1664(auVar4);
                          auVar249 = ZEXT1664(local_940._0_16_);
                          auVar254 = ZEXT1664(auVar124);
                          auVar258 = ZEXT1664(auVar258._0_16_);
                          auVar266 = ZEXT1664(auVar266._0_16_);
                          (*pGVar7->intersectionFilterN)(&local_a70);
                          auVar240 = ZEXT1664(local_ac0._0_16_);
                          auVar194 = ZEXT1664(local_ae0._0_16_);
                          fVar147 = (float)local_aa0._0_4_;
                          if (*local_a70.valid != 0) goto LAB_01922f18;
LAB_01922fbe:
                          (ray->super_RayK<1>).tfar = fVar147;
                        }
                      }
                    }
                  }
                }
                auVar109 = local_5e0;
                bVar90 = lVar89 != 0;
                lVar89 = lVar89 + -1;
              } while ((!bVar61) && (bVar90));
              fVar116 = (ray->super_RayK<1>).tfar;
              auVar111._4_4_ = fVar116;
              auVar111._0_4_ = fVar116;
              auVar111._8_4_ = fVar116;
              auVar111._12_4_ = fVar116;
              auVar111._16_4_ = fVar116;
              auVar111._20_4_ = fVar116;
              auVar111._24_4_ = fVar116;
              auVar111._28_4_ = fVar116;
              auVar102 = vcmpps_avx(_local_720,auVar111,2);
              local_5e0 = vandps_avx(auVar102,local_5e0);
              auVar109 = auVar109 & auVar102;
              uVar88 = local_660._0_8_;
            } while ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar109 >> 0x7f,0) != '\0') ||
                       (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar109 >> 0xbf,0) != '\0') ||
                     (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar109[0x1f] < '\0');
          }
          auVar143._0_4_ = (float)local_760._0_4_ + local_4e0._0_4_;
          auVar143._4_4_ = (float)local_760._4_4_ + local_4e0._4_4_;
          auVar143._8_4_ = fStack_758 + local_4e0._8_4_;
          auVar143._12_4_ = fStack_754 + local_4e0._12_4_;
          auVar143._16_4_ = fStack_750 + local_4e0._16_4_;
          auVar143._20_4_ = fStack_74c + local_4e0._20_4_;
          auVar143._24_4_ = fStack_748 + local_4e0._24_4_;
          auVar143._28_4_ = fStack_744 + local_4e0._28_4_;
          fVar116 = (ray->super_RayK<1>).tfar;
          auVar192._4_4_ = fVar116;
          auVar192._0_4_ = fVar116;
          auVar192._8_4_ = fVar116;
          auVar192._12_4_ = fVar116;
          auVar192._16_4_ = fVar116;
          auVar192._20_4_ = fVar116;
          auVar192._24_4_ = fVar116;
          auVar192._28_4_ = fVar116;
          auVar102 = vcmpps_avx(auVar143,auVar192,2);
          auVar109 = vandps_avx(local_6c0,local_5a0);
          auVar109 = vandps_avx(auVar102,auVar109);
          auVar209._0_4_ = (float)local_760._0_4_ + local_520._0_4_;
          auVar209._4_4_ = (float)local_760._4_4_ + local_520._4_4_;
          auVar209._8_4_ = fStack_758 + local_520._8_4_;
          auVar209._12_4_ = fStack_754 + local_520._12_4_;
          auVar209._16_4_ = fStack_750 + local_520._16_4_;
          auVar209._20_4_ = fStack_74c + local_520._20_4_;
          auVar209._24_4_ = fStack_748 + local_520._24_4_;
          auVar209._28_4_ = fStack_744 + local_520._28_4_;
          auVar145 = vcmpps_avx(auVar209,auVar192,2);
          auVar102 = vandps_avx(_local_780,local_740);
          auVar102 = vandps_avx(auVar145,auVar102);
          auVar102 = vorps_avx(auVar109,auVar102);
          if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar102 >> 0x7f,0) != '\0') ||
                (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar102 >> 0xbf,0) != '\0') ||
              (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar102[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar84 * 0x60) = auVar102;
            auVar109 = vblendvps_avx(_local_520,local_4e0,auVar109);
            *(undefined1 (*) [32])(auStack_160 + uVar84 * 0x60) = auVar109;
            auVar70._8_8_ = uStack_7c8;
            auVar70._0_8_ = local_7d0;
            uVar153 = vmovlps_avx(auVar70);
            *(undefined8 *)(afStack_140 + uVar84 * 0x18) = uVar153;
            auStack_138[uVar84 * 0x18] = (int)uVar88 + 1;
            uVar84 = (ulong)((int)uVar84 + 1);
          }
        }
      }
    }
    fVar116 = (ray->super_RayK<1>).tfar;
    auVar112._4_4_ = fVar116;
    auVar112._0_4_ = fVar116;
    auVar112._8_4_ = fVar116;
    auVar112._12_4_ = fVar116;
    auVar112._16_4_ = fVar116;
    auVar112._20_4_ = fVar116;
    auVar112._24_4_ = fVar116;
    auVar112._28_4_ = fVar116;
    do {
      if ((int)uVar84 == 0) {
        fVar116 = (ray->super_RayK<1>).tfar;
        auVar114._4_4_ = fVar116;
        auVar114._0_4_ = fVar116;
        auVar114._8_4_ = fVar116;
        auVar114._12_4_ = fVar116;
        auVar114._16_4_ = fVar116;
        auVar114._20_4_ = fVar116;
        auVar114._24_4_ = fVar116;
        auVar114._28_4_ = fVar116;
        auVar109 = vcmpps_avx(local_3a0,auVar114,2);
        uVar83 = vmovmskps_avx(auVar109);
        uVar83 = uVar83 & (uint)local_7a8 - 1 & (uint)local_7a8;
        if (uVar83 == 0) {
          return;
        }
        goto LAB_01920cee;
      }
      uVar85 = (ulong)((int)uVar84 - 1);
      lVar89 = uVar85 * 0x60;
      auVar102 = *(undefined1 (*) [32])(auStack_180 + lVar89);
      auVar109 = *(undefined1 (*) [32])(auStack_160 + lVar89);
      auVar144._0_4_ = auVar109._0_4_ + (float)local_760._0_4_;
      auVar144._4_4_ = auVar109._4_4_ + (float)local_760._4_4_;
      auVar144._8_4_ = auVar109._8_4_ + fStack_758;
      auVar144._12_4_ = auVar109._12_4_ + fStack_754;
      auVar144._16_4_ = auVar109._16_4_ + fStack_750;
      auVar144._20_4_ = auVar109._20_4_ + fStack_74c;
      auVar144._24_4_ = auVar109._24_4_ + fStack_748;
      auVar144._28_4_ = auVar109._28_4_ + fStack_744;
      auVar16 = vcmpps_avx(auVar144,auVar112,2);
      auVar145 = vandps_avx(auVar16,auVar102);
      local_4e0 = auVar145;
      auVar164 = auVar102 & auVar16;
      bVar67 = (auVar164 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar68 = (auVar164 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar66 = (auVar164 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar65 = SUB321(auVar164 >> 0x7f,0) == '\0';
      bVar64 = (auVar164 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar63 = SUB321(auVar164 >> 0xbf,0) == '\0';
      bVar90 = (auVar164 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar61 = -1 < auVar164[0x1f];
      if (((((((!bVar67 || !bVar68) || !bVar66) || !bVar65) || !bVar64) || !bVar63) || !bVar90) ||
          !bVar61) {
        auVar193._8_4_ = 0x7f800000;
        auVar193._0_8_ = 0x7f8000007f800000;
        auVar193._12_4_ = 0x7f800000;
        auVar193._16_4_ = 0x7f800000;
        auVar193._20_4_ = 0x7f800000;
        auVar193._24_4_ = 0x7f800000;
        auVar193._28_4_ = 0x7f800000;
        auVar109 = vblendvps_avx(auVar193,auVar109,auVar145);
        auVar102 = vshufps_avx(auVar109,auVar109,0xb1);
        auVar102 = vminps_avx(auVar109,auVar102);
        auVar16 = vshufpd_avx(auVar102,auVar102,5);
        auVar102 = vminps_avx(auVar102,auVar16);
        auVar16 = vpermpd_avx2(auVar102,0x4e);
        auVar102 = vminps_avx(auVar102,auVar16);
        auVar109 = vcmpps_avx(auVar109,auVar102,0);
        auVar102 = auVar145 & auVar109;
        if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar102 >> 0x7f,0) != '\0') ||
              (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar102 >> 0xbf,0) != '\0') ||
            (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar102[0x1f] < '\0') {
          auVar145 = vandps_avx(auVar109,auVar145);
        }
        fVar116 = afStack_140[uVar85 * 0x18 + 1];
        uVar88 = (ulong)auStack_138[uVar85 * 0x18];
        uVar83 = vmovmskps_avx(auVar145);
        iVar18 = 0;
        for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
          iVar18 = iVar18 + 1;
        }
        fVar91 = afStack_140[uVar85 * 0x18];
        auVar146._4_4_ = fVar91;
        auVar146._0_4_ = fVar91;
        auVar146._8_4_ = fVar91;
        auVar146._12_4_ = fVar91;
        auVar146._16_4_ = fVar91;
        auVar146._20_4_ = fVar91;
        auVar146._24_4_ = fVar91;
        auVar146._28_4_ = fVar91;
        *(undefined4 *)(local_4e0 + (uint)(iVar18 << 2)) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar89) = local_4e0;
        if ((((((((local_4e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_4e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_4e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_4e0 >> 0x7f,0) != '\0') ||
              (local_4e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(local_4e0 >> 0xbf,0) != '\0') ||
            (local_4e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_4e0[0x1f] < '\0') {
          uVar85 = uVar84;
        }
        fVar116 = fVar116 - fVar91;
        auVar168._4_4_ = fVar116;
        auVar168._0_4_ = fVar116;
        auVar168._8_4_ = fVar116;
        auVar168._12_4_ = fVar116;
        auVar168._16_4_ = fVar116;
        auVar168._20_4_ = fVar116;
        auVar168._24_4_ = fVar116;
        auVar168._28_4_ = fVar116;
        auVar99 = vfmadd132ps_fma(auVar168,auVar146,_DAT_02020f20);
        _local_520 = ZEXT1632(auVar99);
        local_7d0 = *(undefined8 *)(local_520 + (uint)(iVar18 << 2));
        uStack_7c8 = 0;
        auVar102 = local_4e0;
      }
      uVar84 = uVar85;
      auVar210 = ZEXT3264(auVar16);
      auVar194 = ZEXT3264(auVar102);
    } while (((((((bVar67 && bVar68) && bVar66) && bVar65) && bVar64) && bVar63) && bVar90) &&
             bVar61);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }